

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_6_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  undefined6 uVar26;
  undefined8 uVar27;
  undefined4 uVar28;
  undefined6 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong *puVar53;
  ulong *puVar54;
  undefined8 *in_RCX;
  __m128i *palVar55;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  int in_ESI;
  undefined8 *puVar56;
  long in_RDI;
  undefined8 *puVar57;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar58;
  short sVar59;
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  byte bVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  byte bVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  byte bVar79;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  byte bVar84;
  short sVar85;
  short sVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  byte bVar94;
  ushort uVar95;
  byte bVar99;
  ushort uVar100;
  byte bVar104;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar66 [16];
  ulong uVar64;
  ulong uVar65;
  undefined8 extraout_XMM0_Qa_01;
  byte bVar68;
  byte bVar73;
  byte bVar78;
  byte bVar83;
  ulong uVar90;
  undefined8 extraout_XMM0_Qb_01;
  byte bVar93;
  byte bVar98;
  byte bVar103;
  byte bVar108;
  undefined1 auVar67 [16];
  ulong uVar91;
  undefined8 extraout_XMM0_Qb_02;
  ushort uVar96;
  ushort uVar97;
  ushort uVar101;
  ushort uVar102;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ulong uVar92;
  __m128i alVar109;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  __m128i v_05;
  __m128i v_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i d6d7;
  __m128i d4d5;
  __m128i d2d3;
  __m128i d0d1;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q0;
  __m128i p0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i q0_16;
  __m128i p0_16;
  __m128i q1_16;
  __m128i p1_16;
  __m128i q2_16;
  __m128i p2_16;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  undefined8 local_1348;
  longlong lStack_1340;
  ulong local_1338;
  longlong lStack_1330;
  undefined4 local_1328 [2];
  longlong lStack_1320;
  ulong local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  longlong lStack_1300;
  longlong local_12f8 [3];
  undefined8 uStack_12e0;
  longlong local_12d8 [3];
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  longlong local_1258 [4];
  longlong local_1238 [4];
  longlong local_1218 [3];
  __m128i *in_stack_ffffffffffffee00;
  __m128i *in_stack_ffffffffffffee08;
  __m128i *in_stack_ffffffffffffee10;
  __m128i *in_stack_ffffffffffffee18;
  __m128i *in_stack_ffffffffffffee20;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [52];
  int local_1184;
  long local_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  longlong local_1118;
  undefined8 uStack_1110;
  longlong *local_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 *local_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 *local_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 *local_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 *local_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 *local_1020;
  ushort local_fe8;
  ushort uStack_fe6;
  ushort uStack_fe4;
  ushort uStack_fe2;
  ushort uStack_fe0;
  ushort uStack_fde;
  ushort uStack_fdc;
  ushort uStack_fda;
  ushort local_fd8;
  ushort uStack_fd6;
  ushort uStack_fd4;
  ushort uStack_fd2;
  ushort uStack_fd0;
  ushort uStack_fce;
  ushort uStack_fcc;
  ushort uStack_fca;
  short local_fc8;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fc0;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  short local_fb8;
  short sStack_fb6;
  short sStack_fb4;
  short sStack_fb2;
  short sStack_fb0;
  short sStack_fae;
  short sStack_fac;
  short sStack_faa;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined1 local_f68 [16];
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined1 local_f48;
  undefined1 uStack_f47;
  undefined1 uStack_f46;
  undefined1 uStack_f45;
  undefined1 uStack_f44;
  undefined1 uStack_f43;
  undefined1 uStack_f42;
  undefined1 uStack_f41;
  undefined1 uStack_f40;
  undefined1 uStack_f3f;
  undefined1 uStack_f3e;
  undefined1 uStack_f3d;
  undefined1 uStack_f3c;
  undefined1 uStack_f3b;
  undefined1 uStack_f3a;
  undefined1 uStack_f39;
  ulong local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  uint local_f08;
  uint uStack_f04;
  uint uStack_f00;
  uint uStack_efc;
  undefined1 local_ef8;
  char cStack_ef7;
  undefined1 uStack_ef6;
  char cStack_ef5;
  undefined1 uStack_ef4;
  char cStack_ef3;
  undefined1 uStack_ef2;
  char cStack_ef1;
  undefined1 uStack_ef0;
  char cStack_eef;
  undefined1 uStack_eee;
  char cStack_eed;
  undefined1 uStack_eec;
  char cStack_eeb;
  undefined1 uStack_eea;
  char cStack_ee9;
  undefined1 local_ee8;
  char cStack_ee7;
  undefined1 uStack_ee6;
  char cStack_ee5;
  undefined1 uStack_ee4;
  char cStack_ee3;
  undefined1 uStack_ee2;
  char cStack_ee1;
  undefined1 uStack_ee0;
  char cStack_edf;
  undefined1 uStack_ede;
  char cStack_edd;
  undefined1 uStack_edc;
  char cStack_edb;
  undefined1 uStack_eda;
  char cStack_ed9;
  undefined1 local_ed8;
  char cStack_ed7;
  undefined1 uStack_ed6;
  char cStack_ed5;
  undefined1 uStack_ed4;
  char cStack_ed3;
  undefined1 uStack_ed2;
  char cStack_ed1;
  undefined1 uStack_ed0;
  char cStack_ecf;
  undefined1 uStack_ece;
  char cStack_ecd;
  undefined1 uStack_ecc;
  char cStack_ecb;
  undefined1 uStack_eca;
  char cStack_ec9;
  undefined1 local_ec8;
  char cStack_ec7;
  undefined1 uStack_ec6;
  char cStack_ec5;
  undefined1 uStack_ec4;
  char cStack_ec3;
  undefined1 uStack_ec2;
  char cStack_ec1;
  undefined1 uStack_ec0;
  char cStack_ebf;
  undefined1 uStack_ebe;
  char cStack_ebd;
  undefined1 uStack_ebc;
  char cStack_ebb;
  undefined1 uStack_eba;
  char cStack_eb9;
  undefined1 local_eb8;
  char cStack_eb7;
  undefined1 uStack_eb6;
  char cStack_eb5;
  undefined1 uStack_eb4;
  char cStack_eb3;
  undefined1 uStack_eb2;
  char cStack_eb1;
  undefined1 uStack_eb0;
  char cStack_eaf;
  undefined1 uStack_eae;
  char cStack_ead;
  undefined1 uStack_eac;
  char cStack_eab;
  undefined1 uStack_eaa;
  char cStack_ea9;
  undefined1 local_ea8;
  char cStack_ea7;
  undefined1 uStack_ea6;
  char cStack_ea5;
  undefined1 uStack_ea4;
  char cStack_ea3;
  undefined1 uStack_ea2;
  char cStack_ea1;
  undefined1 uStack_ea0;
  char cStack_e9f;
  undefined1 uStack_e9e;
  char cStack_e9d;
  undefined1 uStack_e9c;
  char cStack_e9b;
  undefined1 uStack_e9a;
  char cStack_e99;
  char local_e98;
  char cStack_e97;
  char cStack_e96;
  char cStack_e95;
  char cStack_e94;
  char cStack_e93;
  char cStack_e92;
  char cStack_e91;
  char cStack_e90;
  char cStack_e8f;
  char cStack_e8e;
  char cStack_e8d;
  char cStack_e8c;
  char cStack_e8b;
  char cStack_e8a;
  char cStack_e89;
  char local_e88;
  char cStack_e87;
  char cStack_e86;
  char cStack_e85;
  char cStack_e84;
  char cStack_e83;
  char cStack_e82;
  char cStack_e81;
  char cStack_e80;
  char cStack_e7f;
  char cStack_e7e;
  char cStack_e7d;
  char cStack_e7c;
  char cStack_e7b;
  char cStack_e7a;
  char cStack_e79;
  undefined4 uStack_e6c;
  undefined8 local_e48;
  undefined8 uStack_e40;
  ulong local_e38;
  ulong uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 (*local_e00) [16];
  undefined1 (*local_df8) [16];
  undefined1 (*local_df0) [16];
  ulong *local_de8;
  ulong *local_de0;
  longlong *local_dd8;
  __m128i *local_dd0;
  __m128i *local_dc8;
  undefined8 *local_dc0;
  longlong *local_db8;
  __m128i *local_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  longlong lStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  longlong lStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  longlong lStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  longlong lStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  longlong lStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c50;
  undefined8 uStack_c20;
  undefined8 uStack_c10;
  undefined1 local_bea;
  undefined1 local_be9;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  ulong uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  ulong local_b48;
  undefined8 uStack_b40;
  ulong local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  byte local_af8;
  byte bStack_af7;
  byte bStack_af6;
  byte bStack_af5;
  byte bStack_af4;
  byte bStack_af3;
  byte bStack_af2;
  byte bStack_af1;
  byte bStack_af0;
  byte bStack_aef;
  byte bStack_aee;
  byte bStack_aed;
  byte bStack_aec;
  byte bStack_aeb;
  byte bStack_aea;
  byte bStack_ae9;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  byte local_ab8;
  byte bStack_ab7;
  byte bStack_ab6;
  byte bStack_ab5;
  byte bStack_ab4;
  byte bStack_ab3;
  byte bStack_ab2;
  byte bStack_ab1;
  byte bStack_ab0;
  byte bStack_aaf;
  byte bStack_aae;
  byte bStack_aad;
  byte bStack_aac;
  byte bStack_aab;
  byte bStack_aaa;
  byte bStack_aa9;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a40;
  undefined8 uStack_a30;
  undefined4 local_a1c;
  ushort local_a18;
  ushort uStack_a16;
  ushort uStack_a14;
  ushort uStack_a12;
  ushort uStack_a10;
  ushort uStack_a0e;
  ushort uStack_a0c;
  ushort uStack_a0a;
  undefined4 local_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined4 local_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined4 local_9bc;
  ushort local_9b8;
  ushort uStack_9b6;
  ushort uStack_9b4;
  ushort uStack_9b2;
  ushort uStack_9b0;
  ushort uStack_9ae;
  ushort uStack_9ac;
  ushort uStack_9aa;
  undefined4 local_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  ulong local_938;
  ulong uStack_930;
  ulong local_928;
  undefined8 uStack_920;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  ulong local_888;
  ulong uStack_880;
  char local_878;
  char cStack_877;
  char cStack_876;
  char cStack_875;
  char cStack_874;
  char cStack_873;
  char cStack_872;
  char cStack_871;
  char cStack_870;
  char cStack_86f;
  char cStack_86e;
  char cStack_86d;
  char cStack_86c;
  char cStack_86b;
  char cStack_86a;
  char cStack_869;
  ulong local_868;
  ulong uStack_860;
  char local_858;
  char cStack_857;
  char cStack_856;
  char cStack_855;
  char cStack_854;
  char cStack_853;
  char cStack_852;
  char cStack_851;
  char cStack_850;
  char cStack_84f;
  char cStack_84e;
  char cStack_84d;
  char cStack_84c;
  char cStack_84b;
  char cStack_84a;
  char cStack_849;
  char local_848;
  char cStack_847;
  char cStack_846;
  char cStack_845;
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  byte bStack_839;
  ulong local_838;
  ulong uStack_830;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  undefined2 local_7aa;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_610;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  short local_5b8;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5b0;
  short sStack_5ae;
  short sStack_5ac;
  short sStack_5aa;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_570;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined1 local_538;
  undefined1 local_537;
  undefined1 local_536;
  undefined1 local_535;
  undefined1 local_534;
  undefined1 local_533;
  undefined1 local_532;
  undefined1 local_531;
  undefined1 local_530;
  undefined1 local_52f;
  undefined1 local_52e;
  undefined1 local_52d;
  undefined1 local_52c;
  undefined1 local_52b;
  undefined1 local_52a;
  undefined1 local_529;
  ulong local_528;
  undefined8 uStack_520;
  undefined1 local_518;
  undefined1 local_517;
  undefined1 local_516;
  undefined1 local_515;
  undefined1 local_514;
  undefined1 local_513;
  undefined1 local_512;
  undefined1 local_511;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_50e;
  undefined1 local_50d;
  undefined1 local_50c;
  undefined1 local_50b;
  undefined1 local_50a;
  undefined1 local_509;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  longlong local_4c8;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined1 local_4a8;
  undefined1 uStack_4a7;
  undefined1 uStack_4a6;
  undefined1 uStack_4a5;
  undefined1 uStack_4a4;
  undefined1 uStack_4a3;
  undefined1 uStack_4a2;
  undefined1 uStack_4a1;
  undefined1 uStack_4a0;
  undefined1 uStack_49f;
  undefined1 uStack_49e;
  undefined1 uStack_49d;
  undefined1 uStack_49c;
  undefined1 uStack_49b;
  undefined1 uStack_49a;
  undefined1 uStack_499;
  undefined8 local_498;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438;
  ulong uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong *local_418;
  ulong *local_410;
  undefined8 *local_408;
  ulong *local_400;
  ulong *local_3f8;
  ulong *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  undefined1 local_359;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  ulong uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  ulong uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined2 local_28;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  undefined2 local_20;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  
  uVar1 = *in_RDX;
  uStack_1120 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_1130 = in_R9[1];
  local_1128._0_4_ = (undefined4)uVar1;
  local_1128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_1138._0_4_ = (undefined4)uVar2;
  local_1138._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_11b8._0_4_ = (undefined4)local_1128;
  local_11b8._4_4_ = (undefined4)local_1138;
  local_11b8._8_4_ = local_1128._4_4_;
  local_11b8._12_4_ = local_1138._4_4_;
  uVar3 = *in_RCX;
  uStack_1140 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_1150 = in_stack_00000008[1];
  local_1148._0_4_ = (undefined4)uVar3;
  local_1148._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_1158._0_4_ = (undefined4)uVar4;
  local_1158._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_11c8._0_4_ = (undefined4)local_1148;
  local_11c8._4_4_ = (undefined4)local_1158;
  local_11c8._8_4_ = local_1148._4_4_;
  local_11c8._12_4_ = local_1158._4_4_;
  local_1168 = *in_R8;
  uStack_1160 = in_R8[1];
  local_1178 = *in_stack_00000010;
  uStack_1170 = in_stack_00000010[1];
  local_1020 = (undefined8 *)(in_RDI + -3);
  local_1268 = *local_1020;
  uStack_1030 = 0;
  uStack_1260 = 0;
  local_1040 = (undefined8 *)(in_RDI + -3 + (long)in_ESI);
  local_1278 = *local_1040;
  uStack_1050 = 0;
  uStack_1270 = 0;
  local_1060 = (undefined8 *)(in_RDI + -3 + (long)(in_ESI * 2));
  local_1288 = *local_1060;
  uStack_1070 = 0;
  uStack_1280 = 0;
  local_1080 = (undefined8 *)(in_RDI + -3 + (long)(in_ESI * 3));
  local_1298 = *local_1080;
  uStack_1090 = 0;
  uStack_1290 = 0;
  local_10a0 = (undefined8 *)(in_RDI + -3 + (long)(in_ESI << 2));
  local_12a8 = *local_10a0;
  uStack_10b0 = 0;
  uStack_12a0 = 0;
  local_10c0 = (undefined8 *)(in_RDI + -3 + (long)(in_ESI * 5));
  local_12b8 = *local_10c0;
  uStack_10d0 = 0;
  uStack_12b0 = 0;
  local_10e0 = (undefined8 *)(in_RDI + -3 + (long)(in_ESI * 6));
  local_12d8[2] = *local_10e0;
  uStack_10f0 = 0;
  uStack_12c0 = 0;
  local_1100 = (longlong *)(in_RDI + -3 + (long)(in_ESI * 7));
  local_12d8[0] = *local_1100;
  uStack_1110 = 0;
  local_12d8[1] = 0;
  palVar55 = (__m128i *)&local_1348;
  puVar57 = &local_1268;
  puVar56 = &local_1278;
  local_1184 = in_ESI;
  local_1180 = in_RDI;
  local_1158 = uVar4;
  local_1148 = uVar3;
  local_1138 = uVar2;
  local_1128 = uVar1;
  local_1118 = local_12d8[0];
  local_10f8 = local_12d8[2];
  local_10d8 = local_12b8;
  local_10b8 = local_12a8;
  local_1098 = local_1298;
  local_1078 = local_1288;
  local_1058 = local_1278;
  local_1038 = local_1268;
  transpose8x8_sse2(palVar55,(__m128i *)&local_1338,(__m128i *)local_1328,(__m128i *)local_12d8,
                    (__m128i *)(local_12d8 + 2),(__m128i *)0xedf5a1,in_stack_ffffffffffffee00,
                    in_stack_ffffffffffffee08,in_stack_ffffffffffffee10,in_stack_ffffffffffffee18,
                    in_stack_ffffffffffffee20,
                    (__m128i *)CONCAT44((undefined4)local_1178,(undefined4)local_1168));
  local_1218[0] = lStack_1330;
  local_1218[1] = 0;
  local_1238[0] = lStack_1340;
  local_1238[1] = 0;
  local_1258[1] = 0;
  local_db8 = local_1238;
  local_dc0 = (undefined8 *)&stack0xffffffffffffee08;
  local_dd8 = local_1218;
  local_de0 = &local_1318;
  local_de8 = &local_1308;
  local_df0 = (undefined1 (*) [16])local_11b8;
  local_df8 = &local_11c8;
  local_e00 = (undefined1 (*) [16])&stack0xffffffffffffee28;
  local_da8 = 0;
  uStack_da0 = 0;
  local_e18 = 0;
  uStack_e10 = 0;
  uStack_c10 = 0;
  uStack_c20 = 0;
  uStack_c50 = 0;
  local_1308 = local_1338;
  lStack_1300 = lStack_1320;
  uStack_e6c = (undefined4)((ulong)lStack_1330 >> 0x20);
  uStack_4ac = uStack_e6c;
  local_4a8 = (undefined1)lStack_1320;
  uStack_4a7 = (undefined1)((ulong)lStack_1320 >> 8);
  uStack_4a6 = (undefined1)((ulong)lStack_1320 >> 0x10);
  uStack_4a5 = (undefined1)((ulong)lStack_1320 >> 0x18);
  local_4c8 = lStack_1320;
  uStack_4bc = local_1348._4_4_;
  _local_4b8 = CONCAT44((int)(local_1338 >> 0x20),local_1328[0]);
  uStack_1310._0_4_ = uStack_4b0;
  uStack_1310._4_4_ = uStack_e6c;
  local_1308._0_4_ = uStack_4c0;
  local_1308._4_4_ = local_1348._4_4_;
  local_be9 = 1;
  local_529 = 1;
  local_52a = 1;
  local_52b = 1;
  local_52c = 1;
  local_52d = 1;
  local_52e = 1;
  local_52f = 1;
  local_530 = 1;
  local_531 = 1;
  local_532 = 1;
  local_533 = 1;
  local_534 = 1;
  local_535 = 1;
  local_536 = 1;
  local_537 = 1;
  local_538 = 1;
  local_f28 = 0x101010101010101;
  uStack_f20 = 0x101010101010101;
  local_bea = 0xfe;
  local_509 = 0xfe;
  local_50a = 0xfe;
  local_50b = 0xfe;
  local_50c = 0xfe;
  local_50d = 0xfe;
  local_50e = 0xfe;
  local_50f = 0xfe;
  local_510 = 0xfe;
  local_511 = 0xfe;
  local_512 = 0xfe;
  local_513 = 0xfe;
  local_514 = 0xfe;
  local_515 = 0xfe;
  local_516 = 0xfe;
  local_517 = 0xfe;
  local_518 = 0xfe;
  local_f38 = 0xfefefefefefefefe;
  uStack_f30 = 0xfefefefefefefefe;
  local_f48 = 0xff;
  uStack_f47 = 0xff;
  uStack_f46 = 0xff;
  uStack_f45 = 0xff;
  uStack_f44 = 0xff;
  uStack_f43 = 0xff;
  uStack_f42 = 0xff;
  uStack_f41 = 0xff;
  uStack_f40 = 0xff;
  uStack_f3f = 0xff;
  uStack_f3e = 0xff;
  uStack_f3d = 0xff;
  uStack_f3c = 0xff;
  uStack_f3b = 0xff;
  uStack_f3a = 0xff;
  uStack_f39 = 0xff;
  alVar109[1] = (longlong)puVar56;
  alVar109[0] = (longlong)puVar57;
  b[1] = (longlong)palVar55;
  b[0] = (longlong)local_dc0;
  local_dd0 = (__m128i *)&local_1338;
  local_dc8 = palVar55;
  local_db0 = (__m128i *)local_1328;
  local_b48 = local_f38;
  uStack_b40 = uStack_f30;
  local_b38 = local_f38;
  uStack_b30 = uStack_f30;
  local_548 = local_f28;
  uStack_540 = uStack_f20;
  local_528 = local_f38;
  uStack_520 = uStack_f30;
  alVar109 = abs_diff(alVar109,b);
  b_00[0] = alVar109[1];
  uStack_f70 = 0;
  a[1] = (longlong)puVar56;
  a[0] = (longlong)puVar57;
  b_00[1] = (longlong)palVar55;
  local_f88 = extraout_XMM0_Qa;
  uStack_f80 = extraout_XMM0_Qb;
  local_f78 = extraout_XMM0_Qb;
  alVar109 = abs_diff(a,b_00);
  b_01[0] = alVar109[1];
  local_c98 = local_e18;
  uStack_c90 = uStack_e10;
  local_a78 = local_f88;
  uVar17 = local_a78;
  uStack_a70 = uStack_f80;
  uVar18 = uStack_a70;
  local_a88 = local_f78;
  uVar15 = local_a88;
  uStack_a80 = uStack_f70;
  uVar16 = uStack_a80;
  local_a78._0_1_ = (byte)local_f88;
  local_a78._1_1_ = (byte)((ulong)local_f88 >> 8);
  local_a78._2_1_ = (byte)((ulong)local_f88 >> 0x10);
  local_a78._3_1_ = (byte)((ulong)local_f88 >> 0x18);
  local_a78._4_1_ = (byte)((ulong)local_f88 >> 0x20);
  local_a78._5_1_ = (byte)((ulong)local_f88 >> 0x28);
  local_a78._6_1_ = (byte)((ulong)local_f88 >> 0x30);
  local_a78._7_1_ = (byte)((ulong)local_f88 >> 0x38);
  uStack_a70._0_1_ = (byte)uStack_f80;
  uStack_a70._1_1_ = (byte)((ulong)uStack_f80 >> 8);
  uStack_a70._2_1_ = (byte)((ulong)uStack_f80 >> 0x10);
  uStack_a70._3_1_ = (byte)((ulong)uStack_f80 >> 0x18);
  uStack_a70._4_1_ = (byte)((ulong)uStack_f80 >> 0x20);
  uStack_a70._5_1_ = (byte)((ulong)uStack_f80 >> 0x28);
  uStack_a70._6_1_ = (byte)((ulong)uStack_f80 >> 0x30);
  uStack_a70._7_1_ = (byte)((ulong)uStack_f80 >> 0x38);
  local_a88._0_1_ = (byte)local_f78;
  local_a88._1_1_ = (byte)((ulong)local_f78 >> 8);
  local_a88._2_1_ = (byte)((ulong)local_f78 >> 0x10);
  local_a88._3_1_ = (byte)((ulong)local_f78 >> 0x18);
  local_a88._4_1_ = (byte)((ulong)local_f78 >> 0x20);
  local_a88._5_1_ = (byte)((ulong)local_f78 >> 0x28);
  local_a88._6_1_ = (byte)((ulong)local_f78 >> 0x30);
  local_a88._7_1_ = (byte)((ulong)local_f78 >> 0x38);
  uStack_a80._0_1_ = (byte)uStack_f70;
  uStack_a80._1_1_ = (byte)((ulong)uStack_f70 >> 8);
  uStack_a80._2_1_ = (byte)((ulong)uStack_f70 >> 0x10);
  uStack_a80._3_1_ = (byte)((ulong)uStack_f70 >> 0x18);
  uStack_a80._4_1_ = (byte)((ulong)uStack_f70 >> 0x20);
  uStack_a80._5_1_ = (byte)((ulong)uStack_f70 >> 0x28);
  uStack_a80._6_1_ = (byte)((ulong)uStack_f70 >> 0x30);
  uStack_a80._7_1_ = (byte)((ulong)uStack_f70 >> 0x38);
  local_e48._0_2_ =
       CONCAT11((local_a78._1_1_ < local_a88._1_1_) * local_a88._1_1_ |
                (local_a78._1_1_ >= local_a88._1_1_) * local_a78._1_1_,
                ((byte)local_a78 < (byte)local_a88) * (byte)local_a88 |
                ((byte)local_a78 >= (byte)local_a88) * (byte)local_a78);
  local_e48._0_3_ =
       CONCAT12((local_a78._2_1_ < local_a88._2_1_) * local_a88._2_1_ |
                (local_a78._2_1_ >= local_a88._2_1_) * local_a78._2_1_,(undefined2)local_e48);
  local_e48._0_4_ =
       CONCAT13((local_a78._3_1_ < local_a88._3_1_) * local_a88._3_1_ |
                (local_a78._3_1_ >= local_a88._3_1_) * local_a78._3_1_,(undefined3)local_e48);
  local_e48._0_5_ =
       CONCAT14((local_a78._4_1_ < local_a88._4_1_) * local_a88._4_1_ |
                (local_a78._4_1_ >= local_a88._4_1_) * local_a78._4_1_,(undefined4)local_e48);
  local_e48._0_6_ =
       CONCAT15((local_a78._5_1_ < local_a88._5_1_) * local_a88._5_1_ |
                (local_a78._5_1_ >= local_a88._5_1_) * local_a78._5_1_,(undefined5)local_e48);
  local_e48._0_7_ =
       CONCAT16((local_a78._6_1_ < local_a88._6_1_) * local_a88._6_1_ |
                (local_a78._6_1_ >= local_a88._6_1_) * local_a78._6_1_,(undefined6)local_e48);
  local_e48 = CONCAT17((local_a78._7_1_ < local_a88._7_1_) * local_a88._7_1_ |
                       (local_a78._7_1_ >= local_a88._7_1_) * local_a78._7_1_,(undefined7)local_e48)
  ;
  uStack_e40._0_1_ =
       ((byte)uStack_a70 < (byte)uStack_a80) * (byte)uStack_a80 |
       ((byte)uStack_a70 >= (byte)uStack_a80) * (byte)uStack_a70;
  uStack_e40._1_1_ =
       (uStack_a70._1_1_ < uStack_a80._1_1_) * uStack_a80._1_1_ |
       (uStack_a70._1_1_ >= uStack_a80._1_1_) * uStack_a70._1_1_;
  uStack_e40._2_1_ =
       (uStack_a70._2_1_ < uStack_a80._2_1_) * uStack_a80._2_1_ |
       (uStack_a70._2_1_ >= uStack_a80._2_1_) * uStack_a70._2_1_;
  uStack_e40._3_1_ =
       (uStack_a70._3_1_ < uStack_a80._3_1_) * uStack_a80._3_1_ |
       (uStack_a70._3_1_ >= uStack_a80._3_1_) * uStack_a70._3_1_;
  uStack_e40._4_1_ =
       (uStack_a70._4_1_ < uStack_a80._4_1_) * uStack_a80._4_1_ |
       (uStack_a70._4_1_ >= uStack_a80._4_1_) * uStack_a70._4_1_;
  uStack_e40._5_1_ =
       (uStack_a70._5_1_ < uStack_a80._5_1_) * uStack_a80._5_1_ |
       (uStack_a70._5_1_ >= uStack_a80._5_1_) * uStack_a70._5_1_;
  uStack_e40._6_1_ =
       (uStack_a70._6_1_ < uStack_a80._6_1_) * uStack_a80._6_1_ |
       (uStack_a70._6_1_ >= uStack_a80._6_1_) * uStack_a70._6_1_;
  uStack_e40._7_1_ =
       (uStack_a70._7_1_ < uStack_a80._7_1_) * uStack_a80._7_1_ |
       (uStack_a70._7_1_ >= uStack_a80._7_1_) * uStack_a70._7_1_;
  local_8a8 = *(undefined8 *)*local_e00;
  uStack_8a0 = *(undefined8 *)(*local_e00 + 8);
  local_898 = local_e48;
  uStack_890 = uStack_e40;
  auVar38._8_8_ = uStack_e40;
  auVar38._0_8_ = local_e48;
  auVar66 = psubusb(auVar38,*local_e00);
  local_e38 = auVar66._0_8_;
  uStack_e30 = auVar66._8_8_;
  local_b58 = local_e38;
  uVar91 = local_b58;
  uStack_b50 = uStack_e30;
  uVar14 = uStack_b50;
  local_b68 = local_e18;
  uVar3 = local_b68;
  uStack_b60 = uStack_e10;
  uVar4 = uStack_b60;
  local_b58._0_1_ = auVar66[0];
  local_b58._1_1_ = auVar66[1];
  local_b58._2_1_ = auVar66[2];
  local_b58._3_1_ = auVar66[3];
  local_b58._4_1_ = auVar66[4];
  local_b58._5_1_ = auVar66[5];
  local_b58._6_1_ = auVar66[6];
  local_b58._7_1_ = auVar66[7];
  uStack_b50._0_1_ = auVar66[8];
  uStack_b50._1_1_ = auVar66[9];
  uStack_b50._2_1_ = auVar66[10];
  uStack_b50._3_1_ = auVar66[0xb];
  uStack_b50._4_1_ = auVar66[0xc];
  uStack_b50._5_1_ = auVar66[0xd];
  uStack_b50._6_1_ = auVar66[0xe];
  uStack_b50._7_1_ = auVar66[0xf];
  local_b68._0_1_ = (char)local_e18;
  local_b68._1_1_ = (char)((ulong)local_e18 >> 8);
  local_b68._2_1_ = (char)((ulong)local_e18 >> 0x10);
  local_b68._3_1_ = (char)((ulong)local_e18 >> 0x18);
  local_b68._4_1_ = (char)((ulong)local_e18 >> 0x20);
  local_b68._5_1_ = (char)((ulong)local_e18 >> 0x28);
  local_b68._6_1_ = (char)((ulong)local_e18 >> 0x30);
  local_b68._7_1_ = (char)((ulong)local_e18 >> 0x38);
  uStack_b60._0_1_ = (char)uStack_e10;
  uStack_b60._1_1_ = (char)((ulong)uStack_e10 >> 8);
  uStack_b60._2_1_ = (char)((ulong)uStack_e10 >> 0x10);
  uStack_b60._3_1_ = (char)((ulong)uStack_e10 >> 0x18);
  uStack_b60._4_1_ = (char)((ulong)uStack_e10 >> 0x20);
  uStack_b60._5_1_ = (char)((ulong)uStack_e10 >> 0x28);
  uStack_b60._6_1_ = (char)((ulong)uStack_e10 >> 0x30);
  uStack_b60._7_1_ = (char)((ulong)uStack_e10 >> 0x38);
  local_858 = -((char)local_b58 == (char)local_b68);
  cStack_857 = -(local_b58._1_1_ == local_b68._1_1_);
  cStack_856 = -(local_b58._2_1_ == local_b68._2_1_);
  cStack_855 = -(local_b58._3_1_ == local_b68._3_1_);
  cStack_854 = -(local_b58._4_1_ == local_b68._4_1_);
  cStack_853 = -(local_b58._5_1_ == local_b68._5_1_);
  cStack_852 = -(local_b58._6_1_ == local_b68._6_1_);
  cStack_851 = -(local_b58._7_1_ == local_b68._7_1_);
  cStack_850 = -((char)uStack_b50 == (char)uStack_b60);
  cStack_84f = -(uStack_b50._1_1_ == uStack_b60._1_1_);
  cStack_84e = -(uStack_b50._2_1_ == uStack_b60._2_1_);
  cStack_84d = -(uStack_b50._3_1_ == uStack_b60._3_1_);
  cStack_84c = -(uStack_b50._4_1_ == uStack_b60._4_1_);
  cStack_84b = -(uStack_b50._5_1_ == uStack_b60._5_1_);
  cStack_84a = -(uStack_b50._6_1_ == uStack_b60._6_1_);
  cStack_849 = -(uStack_b50._7_1_ == uStack_b60._7_1_);
  local_868 = CONCAT17(uStack_f41,
                       CONCAT16(uStack_f42,
                                CONCAT15(uStack_f43,
                                         CONCAT14(uStack_f44,
                                                  CONCAT13(uStack_f45,
                                                           CONCAT12(uStack_f46,
                                                                    CONCAT11(uStack_f47,local_f48)))
                                                 ))));
  uStack_860 = CONCAT17(uStack_f39,
                        CONCAT16(uStack_f3a,
                                 CONCAT15(uStack_f3b,
                                          CONCAT14(uStack_f3c,
                                                   CONCAT13(uStack_f3d,
                                                            CONCAT12(uStack_f3e,
                                                                     CONCAT11(uStack_f3f,uStack_f40)
                                                                    ))))));
  local_cb8 = CONCAT17(cStack_851,
                       CONCAT16(cStack_852,
                                CONCAT15(cStack_853,
                                         CONCAT14(cStack_854,
                                                  CONCAT13(cStack_855,
                                                           CONCAT12(cStack_856,
                                                                    CONCAT11(cStack_857,local_858)))
                                                 )))) ^ local_868;
  uStack_cb0 = CONCAT17(cStack_849,
                        CONCAT16(cStack_84a,
                                 CONCAT15(cStack_84b,
                                          CONCAT14(cStack_84c,
                                                   CONCAT13(cStack_84d,
                                                            CONCAT12(cStack_84e,
                                                                     CONCAT11(cStack_84f,cStack_850)
                                                                    )))))) ^ uStack_860;
  uStack_a30 = local_e18;
  uStack_a40 = local_e18;
  auVar34._8_8_ = local_e18;
  auVar34._0_8_ = extraout_XMM0_Qa_00;
  auVar67._8_8_ = local_e18;
  auVar67._0_8_ = extraout_XMM0_Qa_00;
  local_f68 = paddusb(auVar34,auVar67);
  uStack_910 = 0;
  local_928 = local_f38;
  uStack_920 = uStack_f30;
  uVar64 = extraout_XMM0_Qb_00 & local_f38;
  uStack_990 = 0;
  local_99c = 1;
  local_998._0_2_ = (ushort)uVar64;
  local_998._2_2_ = (ushort)(uVar64 >> 0x10);
  local_998._4_2_ = (ushort)(uVar64 >> 0x20);
  local_f58 = CONCAT26((ushort)(uVar64 >> 0x31),
                       CONCAT24(local_998._4_2_ >> 1,
                                CONCAT22(local_998._2_2_ >> 1,(ushort)local_998 >> 1)));
  uStack_f50 = 0;
  local_a58 = local_f68._0_8_;
  uStack_a50 = local_f68._8_8_;
  local_a68 = local_f58;
  uStack_a60 = 0;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_f58;
  local_8b8 = paddusb(local_f68,auVar66);
  local_8c8 = *(undefined8 *)*local_df0;
  uStack_8c0 = *(undefined8 *)(*local_df0 + 8);
  auVar66 = psubusb(local_8b8,*local_df0);
  local_e28 = auVar66._0_8_;
  uStack_e20 = auVar66._8_8_;
  local_b78 = local_e28;
  uVar1 = local_b78;
  uStack_b70 = uStack_e20;
  uVar2 = uStack_b70;
  local_b88 = local_e18;
  uStack_b80 = uStack_e10;
  local_b78._0_1_ = auVar66[0];
  local_b78._1_1_ = auVar66[1];
  local_b78._2_1_ = auVar66[2];
  local_b78._3_1_ = auVar66[3];
  local_b78._4_1_ = auVar66[4];
  local_b78._5_1_ = auVar66[5];
  local_b78._6_1_ = auVar66[6];
  local_b78._7_1_ = auVar66[7];
  uStack_b70._0_1_ = auVar66[8];
  uStack_b70._1_1_ = auVar66[9];
  uStack_b70._2_1_ = auVar66[10];
  uStack_b70._3_1_ = auVar66[0xb];
  uStack_b70._4_1_ = auVar66[0xc];
  uStack_b70._5_1_ = auVar66[0xd];
  uStack_b70._6_1_ = auVar66[0xe];
  uStack_b70._7_1_ = auVar66[0xf];
  local_878 = -((char)local_b78 == (char)local_b68);
  cStack_877 = -(local_b78._1_1_ == local_b68._1_1_);
  cStack_876 = -(local_b78._2_1_ == local_b68._2_1_);
  cStack_875 = -(local_b78._3_1_ == local_b68._3_1_);
  cStack_874 = -(local_b78._4_1_ == local_b68._4_1_);
  cStack_873 = -(local_b78._5_1_ == local_b68._5_1_);
  cStack_872 = -(local_b78._6_1_ == local_b68._6_1_);
  cStack_871 = -(local_b78._7_1_ == local_b68._7_1_);
  cStack_870 = -((char)uStack_b70 == (char)uStack_b60);
  cStack_86f = -(uStack_b70._1_1_ == uStack_b60._1_1_);
  cStack_86e = -(uStack_b70._2_1_ == uStack_b60._2_1_);
  cStack_86d = -(uStack_b70._3_1_ == uStack_b60._3_1_);
  cStack_86c = -(uStack_b70._4_1_ == uStack_b60._4_1_);
  cStack_86b = -(uStack_b70._5_1_ == uStack_b60._5_1_);
  cStack_86a = -(uStack_b70._6_1_ == uStack_b60._6_1_);
  cStack_869 = -(uStack_b70._7_1_ == uStack_b60._7_1_);
  local_888 = CONCAT17(uStack_f41,
                       CONCAT16(uStack_f42,
                                CONCAT15(uStack_f43,
                                         CONCAT14(uStack_f44,
                                                  CONCAT13(uStack_f45,
                                                           CONCAT12(uStack_f46,
                                                                    CONCAT11(uStack_f47,local_f48)))
                                                 ))));
  uStack_880 = CONCAT17(uStack_f39,
                        CONCAT16(uStack_f3a,
                                 CONCAT15(uStack_f3b,
                                          CONCAT14(uStack_f3c,
                                                   CONCAT13(uStack_f3d,
                                                            CONCAT12(uStack_f3e,
                                                                     CONCAT11(uStack_f3f,uStack_f40)
                                                                    ))))));
  uVar65 = CONCAT17(cStack_871,
                    CONCAT16(cStack_872,
                             CONCAT15(cStack_873,
                                      CONCAT14(cStack_874,
                                               CONCAT13(cStack_875,
                                                        CONCAT12(cStack_876,
                                                                 CONCAT11(cStack_877,local_878))))))
                   ) ^ local_888;
  uVar90 = CONCAT17(cStack_869,
                    CONCAT16(cStack_86a,
                             CONCAT15(cStack_86b,
                                      CONCAT14(cStack_86c,
                                               CONCAT13(cStack_86d,
                                                        CONCAT12(cStack_86e,
                                                                 CONCAT11(cStack_86f,cStack_870)))))
                            )) ^ uStack_880;
  local_a98 = local_f88;
  uStack_a90 = uStack_f80;
  local_aa8._0_1_ = (byte)uVar65;
  local_aa8._1_1_ = (byte)(uVar65 >> 8);
  local_aa8._2_1_ = (byte)(uVar65 >> 0x10);
  local_aa8._3_1_ = (byte)(uVar65 >> 0x18);
  local_aa8._4_1_ = (byte)(uVar65 >> 0x20);
  local_aa8._5_1_ = (byte)(uVar65 >> 0x28);
  local_aa8._6_1_ = (byte)(uVar65 >> 0x30);
  local_aa8._7_1_ = (byte)(uVar65 >> 0x38);
  uStack_aa0._0_1_ = (byte)uVar90;
  uStack_aa0._1_1_ = (byte)(uVar90 >> 8);
  uStack_aa0._2_1_ = (byte)(uVar90 >> 0x10);
  uStack_aa0._3_1_ = (byte)(uVar90 >> 0x18);
  uStack_aa0._4_1_ = (byte)(uVar90 >> 0x20);
  uStack_aa0._5_1_ = (byte)(uVar90 >> 0x28);
  uStack_aa0._6_1_ = (byte)(uVar90 >> 0x30);
  uStack_aa0._7_1_ = (byte)(uVar90 >> 0x38);
  local_e28._1_1_ =
       (local_a78._1_1_ < local_aa8._1_1_) * local_aa8._1_1_ |
       (local_a78._1_1_ >= local_aa8._1_1_) * local_a78._1_1_;
  local_e28._0_1_ =
       ((byte)local_a78 < (byte)local_aa8) * (byte)local_aa8 |
       ((byte)local_a78 >= (byte)local_aa8) * (byte)local_a78;
  local_e28._2_1_ =
       (local_a78._2_1_ < local_aa8._2_1_) * local_aa8._2_1_ |
       (local_a78._2_1_ >= local_aa8._2_1_) * local_a78._2_1_;
  local_e28._3_1_ =
       (local_a78._3_1_ < local_aa8._3_1_) * local_aa8._3_1_ |
       (local_a78._3_1_ >= local_aa8._3_1_) * local_a78._3_1_;
  local_e28._4_1_ =
       (local_a78._4_1_ < local_aa8._4_1_) * local_aa8._4_1_ |
       (local_a78._4_1_ >= local_aa8._4_1_) * local_a78._4_1_;
  local_e28._5_1_ =
       (local_a78._5_1_ < local_aa8._5_1_) * local_aa8._5_1_ |
       (local_a78._5_1_ >= local_aa8._5_1_) * local_a78._5_1_;
  local_e28._6_1_ =
       (local_a78._6_1_ < local_aa8._6_1_) * local_aa8._6_1_ |
       (local_a78._6_1_ >= local_aa8._6_1_) * local_a78._6_1_;
  local_e28._7_1_ =
       (local_a78._7_1_ < local_aa8._7_1_) * local_aa8._7_1_ |
       (local_a78._7_1_ >= local_aa8._7_1_) * local_a78._7_1_;
  uStack_e20._0_1_ =
       ((byte)uStack_a70 < (byte)uStack_aa0) * (byte)uStack_aa0 |
       ((byte)uStack_a70 >= (byte)uStack_aa0) * (byte)uStack_a70;
  uStack_e20._1_1_ =
       (uStack_a70._1_1_ < uStack_aa0._1_1_) * uStack_aa0._1_1_ |
       (uStack_a70._1_1_ >= uStack_aa0._1_1_) * uStack_a70._1_1_;
  uStack_e20._2_1_ =
       (uStack_a70._2_1_ < uStack_aa0._2_1_) * uStack_aa0._2_1_ |
       (uStack_a70._2_1_ >= uStack_aa0._2_1_) * uStack_a70._2_1_;
  uStack_e20._3_1_ =
       (uStack_a70._3_1_ < uStack_aa0._3_1_) * uStack_aa0._3_1_ |
       (uStack_a70._3_1_ >= uStack_aa0._3_1_) * uStack_a70._3_1_;
  uStack_e20._4_1_ =
       (uStack_a70._4_1_ < uStack_aa0._4_1_) * uStack_aa0._4_1_ |
       (uStack_a70._4_1_ >= uStack_aa0._4_1_) * uStack_a70._4_1_;
  uStack_e20._5_1_ =
       (uStack_a70._5_1_ < uStack_aa0._5_1_) * uStack_aa0._5_1_ |
       (uStack_a70._5_1_ >= uStack_aa0._5_1_) * uStack_a70._5_1_;
  uStack_e20._6_1_ =
       (uStack_a70._6_1_ < uStack_aa0._6_1_) * uStack_aa0._6_1_ |
       (uStack_a70._6_1_ >= uStack_aa0._6_1_) * uStack_a70._6_1_;
  uStack_e20._7_1_ =
       (uStack_a70._7_1_ < uStack_aa0._7_1_) * uStack_aa0._7_1_ |
       (uStack_a70._7_1_ >= uStack_aa0._7_1_) * uStack_a70._7_1_;
  a_00[1] = (longlong)puVar56;
  a_00[0] = (longlong)puVar57;
  b_01[1] = (longlong)palVar55;
  local_ca8 = local_cb8;
  uStack_ca0 = uStack_cb0;
  local_b78 = uVar1;
  uStack_b70 = uVar2;
  local_b68 = uVar3;
  uStack_b60 = uVar4;
  local_b58 = uVar91;
  uStack_b50 = uVar14;
  local_aa8 = uVar65;
  uStack_aa0 = uVar90;
  local_a88 = uVar15;
  uStack_a80 = uVar16;
  local_a78 = uVar17;
  uStack_a70 = uVar18;
  local_998 = uVar64;
  local_e38 = local_cb8;
  uStack_e30 = local_cb8;
  abs_diff(a_00,b_01);
  puVar53 = local_de0;
  local_ac8 = local_e28;
  uVar14 = local_ac8;
  uStack_ac0 = uStack_e20;
  uVar15 = uStack_ac0;
  local_ab8 = (byte)extraout_XMM0_Qa_01;
  bStack_ab7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_ab6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_ab5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_ab4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_ab3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_ab2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_ab1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_ab0 = (byte)extraout_XMM0_Qb_01;
  bStack_aaf = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_aae = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_aad = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_aac = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_aab = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_aaa = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_aa9 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_ac8._0_1_ = (byte)local_e28;
  local_ac8._1_1_ = local_e28._1_1_;
  local_ac8._2_1_ = local_e28._2_1_;
  local_ac8._3_1_ = local_e28._3_1_;
  local_ac8._4_1_ = local_e28._4_1_;
  local_ac8._5_1_ = local_e28._5_1_;
  local_ac8._6_1_ = local_e28._6_1_;
  local_ac8._7_1_ = local_e28._7_1_;
  uStack_ac0._0_1_ = local_e28._8_1_;
  uStack_ac0._1_1_ = local_e28._9_1_;
  uStack_ac0._2_1_ = local_e28._10_1_;
  uStack_ac0._3_1_ = local_e28._11_1_;
  uStack_ac0._4_1_ = local_e28._12_1_;
  uStack_ac0._5_1_ = local_e28._13_1_;
  uStack_ac0._6_1_ = local_e28._14_1_;
  uStack_ac0._7_1_ = local_e28._15_1_;
  bVar58 = (local_ab8 < (byte)local_ac8) * (byte)local_ac8 |
           (local_ab8 >= (byte)local_ac8) * local_ab8;
  bVar68 = (bStack_ab7 < local_ac8._1_1_) * local_ac8._1_1_ |
           (bStack_ab7 >= local_ac8._1_1_) * bStack_ab7;
  bVar69 = (bStack_ab6 < local_ac8._2_1_) * local_ac8._2_1_ |
           (bStack_ab6 >= local_ac8._2_1_) * bStack_ab6;
  bVar73 = (bStack_ab5 < local_ac8._3_1_) * local_ac8._3_1_ |
           (bStack_ab5 >= local_ac8._3_1_) * bStack_ab5;
  bVar74 = (bStack_ab4 < local_ac8._4_1_) * local_ac8._4_1_ |
           (bStack_ab4 >= local_ac8._4_1_) * bStack_ab4;
  bVar78 = (bStack_ab3 < local_ac8._5_1_) * local_ac8._5_1_ |
           (bStack_ab3 >= local_ac8._5_1_) * bStack_ab3;
  bVar79 = (bStack_ab2 < local_ac8._6_1_) * local_ac8._6_1_ |
           (bStack_ab2 >= local_ac8._6_1_) * bStack_ab2;
  bVar83 = (bStack_ab1 < local_ac8._7_1_) * local_ac8._7_1_ |
           (bStack_ab1 >= local_ac8._7_1_) * bStack_ab1;
  bVar84 = (bStack_ab0 < (byte)uStack_ac0) * (byte)uStack_ac0 |
           (bStack_ab0 >= (byte)uStack_ac0) * bStack_ab0;
  bVar93 = (bStack_aaf < uStack_ac0._1_1_) * uStack_ac0._1_1_ |
           (bStack_aaf >= uStack_ac0._1_1_) * bStack_aaf;
  bVar94 = (bStack_aae < uStack_ac0._2_1_) * uStack_ac0._2_1_ |
           (bStack_aae >= uStack_ac0._2_1_) * bStack_aae;
  bVar98 = (bStack_aad < uStack_ac0._3_1_) * uStack_ac0._3_1_ |
           (bStack_aad >= uStack_ac0._3_1_) * bStack_aad;
  bVar99 = (bStack_aac < uStack_ac0._4_1_) * uStack_ac0._4_1_ |
           (bStack_aac >= uStack_ac0._4_1_) * bStack_aac;
  bVar103 = (bStack_aab < uStack_ac0._5_1_) * uStack_ac0._5_1_ |
            (bStack_aab >= uStack_ac0._5_1_) * bStack_aab;
  bVar104 = (bStack_aaa < uStack_ac0._6_1_) * uStack_ac0._6_1_ |
            (bStack_aaa >= uStack_ac0._6_1_) * bStack_aaa;
  bVar108 = (bStack_aa9 < uStack_ac0._7_1_) * uStack_ac0._7_1_ |
            (bStack_aa9 >= uStack_ac0._7_1_) * bStack_aa9;
  local_e28._0_2_ = CONCAT11(bVar68,bVar58);
  local_e28._0_3_ = CONCAT12(bVar69,(undefined2)local_e28);
  local_e28._0_4_ = CONCAT13(bVar73,(undefined3)local_e28);
  local_e28._0_5_ = CONCAT14(bVar74,(undefined4)local_e28);
  local_e28._0_6_ = CONCAT15(bVar78,(undefined5)local_e28);
  local_e28._0_7_ = CONCAT16(bVar79,(undefined6)local_e28);
  local_e28 = CONCAT17(bVar83,(undefined7)local_e28);
  uStack_e20._0_1_ = bVar84;
  uStack_e20._1_1_ = bVar93;
  uStack_e20._2_1_ = bVar94;
  uStack_e20._3_1_ = bVar98;
  uStack_e20._4_1_ = bVar99;
  uStack_e20._5_1_ = bVar103;
  uStack_e20._6_1_ = bVar104;
  uStack_e20._7_1_ = bVar108;
  local_ad8 = local_e28;
  uStack_ad0 = uStack_e20;
  local_ae8 = uStack_e20;
  uStack_ae0 = 0;
  local_e28._0_2_ =
       CONCAT11((bVar68 < bVar93) * bVar93 | (bVar68 >= bVar93) * bVar68,
                (bVar58 < bVar84) * bVar84 | (bVar58 >= bVar84) * bVar58);
  local_e28._0_3_ =
       CONCAT12((bVar69 < bVar94) * bVar94 | (bVar69 >= bVar94) * bVar69,(undefined2)local_e28);
  local_e28._0_4_ =
       CONCAT13((bVar73 < bVar98) * bVar98 | (bVar73 >= bVar98) * bVar73,(undefined3)local_e28);
  local_e28._0_5_ =
       CONCAT14((bVar74 < bVar99) * bVar99 | (bVar74 >= bVar99) * bVar74,(undefined4)local_e28);
  local_e28._0_6_ =
       CONCAT15((bVar78 < bVar103) * bVar103 | (bVar78 >= bVar103) * bVar78,(undefined5)local_e28);
  local_e28._0_7_ =
       CONCAT16((bVar79 < bVar104) * bVar104 | (bVar79 >= bVar104) * bVar79,(undefined6)local_e28);
  local_e28 = CONCAT17((bVar83 < bVar108) * bVar108 | (bVar83 >= bVar108) * bVar83,
                       (undefined7)local_e28);
  local_8e8 = *(undefined8 *)*local_df8;
  uStack_8e0 = *(undefined8 *)(*local_df8 + 8);
  local_8d8 = local_e28;
  uStack_8d0 = uStack_e20;
  auVar37._8_8_ = uStack_e20;
  auVar37._0_8_ = local_e28;
  auVar66 = psubusb(auVar37,*local_df8);
  local_e28 = auVar66._0_8_;
  uStack_e20 = auVar66._8_8_;
  local_b98 = local_e28;
  uVar3 = local_b98;
  uStack_b90 = uStack_e20;
  uVar4 = uStack_b90;
  local_ba8 = local_e18;
  uVar1 = local_ba8;
  uStack_ba0 = uStack_e10;
  uVar2 = uStack_ba0;
  local_b98._0_1_ = auVar66[0];
  local_b98._1_1_ = auVar66[1];
  local_b98._2_1_ = auVar66[2];
  local_b98._3_1_ = auVar66[3];
  local_b98._4_1_ = auVar66[4];
  local_b98._5_1_ = auVar66[5];
  local_b98._6_1_ = auVar66[6];
  local_b98._7_1_ = auVar66[7];
  uStack_b90._0_1_ = auVar66[8];
  uStack_b90._1_1_ = auVar66[9];
  uStack_b90._2_1_ = auVar66[10];
  uStack_b90._3_1_ = auVar66[0xb];
  uStack_b90._4_1_ = auVar66[0xc];
  uStack_b90._5_1_ = auVar66[0xd];
  uStack_b90._6_1_ = auVar66[0xe];
  uStack_b90._7_1_ = auVar66[0xf];
  local_ba8._0_1_ = (char)local_e18;
  local_ba8._1_1_ = (char)((ulong)local_e18 >> 8);
  local_ba8._2_1_ = (char)((ulong)local_e18 >> 0x10);
  local_ba8._3_1_ = (char)((ulong)local_e18 >> 0x18);
  local_ba8._4_1_ = (char)((ulong)local_e18 >> 0x20);
  local_ba8._5_1_ = (char)((ulong)local_e18 >> 0x28);
  local_ba8._6_1_ = (char)((ulong)local_e18 >> 0x30);
  local_ba8._7_1_ = (char)((ulong)local_e18 >> 0x38);
  uStack_ba0._0_1_ = (char)uStack_e10;
  uStack_ba0._1_1_ = (char)((ulong)uStack_e10 >> 8);
  uStack_ba0._2_1_ = (char)((ulong)uStack_e10 >> 0x10);
  uStack_ba0._3_1_ = (char)((ulong)uStack_e10 >> 0x18);
  uStack_ba0._4_1_ = (char)((ulong)uStack_e10 >> 0x20);
  uStack_ba0._5_1_ = (char)((ulong)uStack_e10 >> 0x28);
  uStack_ba0._6_1_ = (char)((ulong)uStack_e10 >> 0x30);
  uStack_ba0._7_1_ = (char)((ulong)uStack_e10 >> 0x38);
  local_e28._0_2_ =
       CONCAT11(-(local_b98._1_1_ == local_ba8._1_1_),-((char)local_b98 == (char)local_ba8));
  local_e28._0_3_ = CONCAT12(-(local_b98._2_1_ == local_ba8._2_1_),(undefined2)local_e28);
  local_e28._0_4_ = CONCAT13(-(local_b98._3_1_ == local_ba8._3_1_),(undefined3)local_e28);
  local_e28._0_5_ = CONCAT14(-(local_b98._4_1_ == local_ba8._4_1_),(undefined4)local_e28);
  local_e28._0_6_ = CONCAT15(-(local_b98._5_1_ == local_ba8._5_1_),(undefined5)local_e28);
  local_e28._0_7_ = CONCAT16(-(local_b98._6_1_ == local_ba8._6_1_),(undefined6)local_e28);
  local_e28 = CONCAT17(-(local_b98._7_1_ == local_ba8._7_1_),(undefined7)local_e28);
  uStack_e20._0_1_ = -((char)uStack_b90 == (char)uStack_ba0);
  uStack_e20._1_1_ = -(uStack_b90._1_1_ == uStack_ba0._1_1_);
  uStack_e20._2_1_ = -(uStack_b90._2_1_ == uStack_ba0._2_1_);
  uStack_e20._3_1_ = -(uStack_b90._3_1_ == uStack_ba0._3_1_);
  uStack_e20._4_1_ = -(uStack_b90._4_1_ == uStack_ba0._4_1_);
  uStack_e20._5_1_ = -(uStack_b90._5_1_ == uStack_ba0._5_1_);
  uStack_e20._6_1_ = -(uStack_b90._6_1_ == uStack_ba0._6_1_);
  uStack_e20._7_1_ = -(uStack_b90._7_1_ == uStack_ba0._7_1_);
  local_3f0 = local_de8;
  local_3f8 = local_de0;
  local_400 = &local_e38;
  local_410 = local_de0;
  local_418 = local_de8;
  local_ad = 3;
  local_ae = 3;
  local_af = 3;
  local_b0 = 3;
  local_b1 = 3;
  local_b2 = 3;
  local_b3 = 3;
  local_b4 = 3;
  local_b5 = 4;
  local_b6 = 4;
  local_b7 = 4;
  local_b8 = 4;
  local_b9 = 4;
  local_ba = 4;
  local_bb = 4;
  local_bc = 4;
  local_428 = 0x404040404040404;
  uStack_420 = 0x303030303030303;
  local_359 = 0x80;
  local_d9 = 0x80;
  local_da = 0x80;
  local_db = 0x80;
  local_dc = 0x80;
  local_dd = 0x80;
  local_de = 0x80;
  local_df = 0x80;
  local_e0 = 0x80;
  local_e1 = 0x80;
  local_e2 = 0x80;
  local_e3 = 0x80;
  local_e4 = 0x80;
  local_e5 = 0x80;
  local_e6 = 0x80;
  local_e7 = 0x80;
  local_e8 = 0x80;
  local_438 = 0x8080808080808080;
  uStack_430 = 0x8080808080808080;
  local_4a8 = 0xff;
  uStack_4a7 = 0xff;
  uStack_4a6 = 0xff;
  uStack_4a5 = 0xff;
  uStack_4a4 = 0xff;
  uStack_4a3 = 0xff;
  uStack_4a2 = 0xff;
  uStack_4a1 = 0xff;
  uStack_4a0 = 0xff;
  uStack_49f = 0xff;
  uStack_49e = 0xff;
  uStack_49d = 0xff;
  uStack_49c = 0xff;
  uStack_49b = 0xff;
  uStack_49a = 0xff;
  uStack_499 = 0xff;
  local_288 = *local_de8;
  uStack_280 = local_de8[1];
  local_1c8 = local_288 ^ 0x8080808080808080;
  uStack_1c0 = uStack_280 ^ 0x8080808080808080;
  local_2a8 = *local_de0;
  uStack_2a0 = local_de0[1];
  local_1d8 = local_2a8 ^ 0x8080808080808080;
  uStack_260 = uStack_2a0 ^ 0x8080808080808080;
  auVar45._8_8_ = uStack_1c0;
  auVar45._0_8_ = local_1c8;
  auVar44._8_8_ = uStack_260;
  auVar44._0_8_ = local_1d8;
  local_468 = psubsb(auVar45,auVar44);
  local_318 = local_e38;
  uStack_310 = uStack_e30;
  local_308 = local_468._8_8_;
  uStack_300 = 0;
  local_1e8 = local_468._8_8_ & local_e38;
  uStack_1e0 = 0;
  local_1f8 = local_468._0_8_;
  uStack_1f0 = local_468._8_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_1e8;
  auVar66 = psubsb(auVar43,local_468);
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_208 = local_448;
  uStack_200 = uStack_440;
  local_218 = local_468._0_8_;
  uStack_210 = local_468._8_8_;
  auVar66 = psubsb(auVar66,local_468);
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_228 = local_448;
  uStack_220 = uStack_440;
  local_238 = local_468._0_8_;
  uStack_230 = local_468._8_8_;
  auVar66 = psubsb(auVar66,local_468);
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_338 = local_e28;
  uStack_330 = uStack_e20;
  local_328 = local_448;
  uStack_320 = uStack_440;
  local_388 = local_448 & local_e28;
  uStack_380 = uStack_440 & uStack_e20;
  auVar49._8_8_ = local_388;
  auVar49._0_8_ = local_388;
  auVar48._8_8_ = 0x303030303030303;
  auVar48._0_8_ = 0x404040404040404;
  auVar66 = paddsb(auVar49,auVar48);
  local_458 = auVar66._0_8_;
  uStack_450 = auVar66._8_8_;
  local_148 = local_458;
  uStack_140 = uStack_450;
  uVar18 = uStack_140;
  local_158 = local_458;
  uStack_150 = uStack_450;
  uStack_140._0_1_ = auVar66[8];
  uStack_140._1_1_ = auVar66[9];
  uStack_140._2_1_ = auVar66[10];
  uStack_140._3_1_ = auVar66[0xb];
  uStack_140._4_1_ = auVar66[0xc];
  uStack_140._5_1_ = auVar66[0xd];
  uStack_140._6_1_ = auVar66[0xe];
  uStack_140._7_1_ = auVar66[0xf];
  local_448._0_2_ = CONCAT11((undefined1)uStack_140,(undefined1)uStack_140);
  local_448._0_3_ = CONCAT12(uStack_140._1_1_,(undefined2)local_448);
  local_448._0_4_ = CONCAT13(uStack_140._1_1_,(undefined3)local_448);
  local_448._0_5_ = CONCAT14(uStack_140._2_1_,(undefined4)local_448);
  local_448._0_6_ = CONCAT15(uStack_140._2_1_,(undefined5)local_448);
  local_448._0_7_ = CONCAT16(uStack_140._3_1_,(undefined6)local_448);
  local_448 = CONCAT17(uStack_140._3_1_,(undefined7)local_448);
  uStack_440._0_1_ = uStack_140._4_1_;
  uStack_440._1_1_ = uStack_140._4_1_;
  uStack_440._2_1_ = uStack_140._5_1_;
  uStack_440._3_1_ = uStack_140._5_1_;
  uStack_440._4_1_ = uStack_140._6_1_;
  uStack_440._5_1_ = uStack_140._6_1_;
  uStack_440._6_1_ = uStack_140._7_1_;
  uStack_440._7_1_ = uStack_140._7_1_;
  local_3b8 = local_458;
  uVar17 = local_3b8;
  uStack_3b0 = uStack_450;
  local_3c8 = local_458;
  uStack_3c0 = uStack_450;
  local_3b8._0_1_ = auVar66[0];
  local_3b8._1_1_ = auVar66[1];
  local_3b8._2_1_ = auVar66[2];
  local_3b8._3_1_ = auVar66[3];
  local_3b8._4_1_ = auVar66[4];
  local_3b8._5_1_ = auVar66[5];
  local_3b8._6_1_ = auVar66[6];
  local_3b8._7_1_ = auVar66[7];
  local_458._0_2_ = CONCAT11((undefined1)local_3b8,(undefined1)local_3b8);
  local_458._0_3_ = CONCAT12(local_3b8._1_1_,(undefined2)local_458);
  local_458._0_4_ = CONCAT13(local_3b8._1_1_,(undefined3)local_458);
  local_458._0_5_ = CONCAT14(local_3b8._2_1_,(undefined4)local_458);
  local_458._0_6_ = CONCAT15(local_3b8._2_1_,(undefined5)local_458);
  local_458._0_7_ = CONCAT16(local_3b8._3_1_,(undefined6)local_458);
  local_458 = CONCAT17(local_3b8._3_1_,(undefined7)local_458);
  uStack_450._0_1_ = local_3b8._4_1_;
  uStack_450._1_1_ = local_3b8._4_1_;
  uStack_450._2_1_ = local_3b8._5_1_;
  uStack_450._3_1_ = local_3b8._5_1_;
  uStack_450._4_1_ = local_3b8._6_1_;
  uStack_450._5_1_ = local_3b8._6_1_;
  uStack_450._6_1_ = local_3b8._7_1_;
  uStack_450._7_1_ = local_3b8._7_1_;
  local_68 = local_458;
  uStack_60 = uStack_450;
  local_6c = 0xb;
  auVar52._8_8_ = uStack_450;
  auVar52._0_8_ = local_458;
  auVar66 = psraw(auVar52,ZEXT416(0xb));
  local_88 = local_448;
  uStack_80 = uStack_440;
  local_8c = 0xb;
  auVar51._8_8_ = uStack_440;
  auVar51._0_8_ = local_448;
  auVar67 = psraw(auVar51,ZEXT416(0xb));
  local_458 = auVar66._0_8_;
  uStack_450 = auVar66._8_8_;
  local_448 = auVar67._0_8_;
  uStack_440 = auVar67._8_8_;
  local_108 = local_458;
  uStack_100 = uStack_450;
  local_118 = local_448;
  uStack_110 = uStack_440;
  auVar67 = packsswb(auVar66,auVar67);
  local_458 = auVar67._0_8_;
  uStack_450 = auVar67._8_8_;
  uStack_390 = uStack_450;
  local_258 = 0xffffffffffffffff;
  uStack_250 = 0xffffffffffffffff;
  local_248 = local_458;
  uStack_240 = uStack_450;
  auVar42._8_8_ = 0xffffffffffffffff;
  auVar42._0_8_ = 0xffffffffffffffff;
  auVar66 = psubsb(auVar67,auVar42);
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_3d8 = local_448;
  uVar16 = local_3d8;
  uStack_3d0 = uStack_440;
  local_3e8 = local_448;
  uStack_3e0 = uStack_440;
  local_3d8._0_1_ = auVar66[0];
  local_3d8._1_1_ = auVar66[1];
  local_3d8._2_1_ = auVar66[2];
  local_3d8._3_1_ = auVar66[3];
  local_3d8._4_1_ = auVar66[4];
  local_3d8._5_1_ = auVar66[5];
  local_3d8._6_1_ = auVar66[6];
  local_3d8._7_1_ = auVar66[7];
  local_448._0_2_ = CONCAT11((undefined1)local_3d8,(undefined1)local_3d8);
  local_448._0_3_ = CONCAT12(local_3d8._1_1_,(undefined2)local_448);
  local_448._0_4_ = CONCAT13(local_3d8._1_1_,(undefined3)local_448);
  local_448._0_5_ = CONCAT14(local_3d8._2_1_,(undefined4)local_448);
  local_448._0_6_ = CONCAT15(local_3d8._2_1_,(undefined5)local_448);
  local_448._0_7_ = CONCAT16(local_3d8._3_1_,(undefined6)local_448);
  local_448 = CONCAT17(local_3d8._3_1_,(undefined7)local_448);
  uStack_440._0_1_ = local_3d8._4_1_;
  uStack_440._1_1_ = local_3d8._4_1_;
  uStack_440._2_1_ = local_3d8._5_1_;
  uStack_440._3_1_ = local_3d8._5_1_;
  uStack_440._4_1_ = local_3d8._6_1_;
  uStack_440._5_1_ = local_3d8._6_1_;
  uStack_440._6_1_ = local_3d8._7_1_;
  uStack_440._7_1_ = local_3d8._7_1_;
  local_a8 = local_448;
  uStack_a0 = uStack_440;
  local_ac = 9;
  auVar50._8_8_ = uStack_440;
  auVar50._0_8_ = local_448;
  auVar66 = psraw(auVar50,ZEXT416(9));
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_128 = local_448;
  uStack_120 = uStack_440;
  local_138 = local_448;
  uStack_130 = uStack_440;
  auVar66 = packsswb(auVar66,auVar66);
  local_168 = local_e38;
  uStack_160 = uStack_e30;
  local_448 = auVar66._0_8_;
  uStack_440 = auVar66._8_8_;
  local_178 = local_448;
  uStack_170 = uStack_440;
  local_3a8 = ~local_e38 & local_448;
  uStack_3a0 = ~uStack_e30 & uStack_440;
  uStack_440 = uStack_3a0;
  local_448 = local_3a8;
  auVar66 = _local_448;
  uStack_450._4_4_ = auVar67._12_4_;
  uVar10 = uStack_450._4_4_;
  local_448._0_4_ = (undefined4)local_3a8;
  uStack_440._4_4_ = (undefined4)(uStack_3a0 >> 0x20);
  uStack_3c = uStack_450._4_4_;
  local_38 = CONCAT44(local_38._4_4_,(undefined4)local_448);
  uStack_4c = uStack_440._4_4_;
  _local_48 = CONCAT44(auVar67._4_4_,0x80808080);
  uStack_490 = uStack_40;
  uStack_48c = uStack_450._4_4_;
  local_488._4_4_ = uStack_440._4_4_;
  local_488._0_4_ = uStack_50;
  local_398 = local_458;
  uStack_450 = local_3a8;
  local_268 = local_488._0_8_;
  local_278 = local_458;
  auVar41._8_8_ = uStack_260;
  auVar41._0_8_ = local_488._0_8_;
  auVar40._8_8_ = local_3a8;
  auVar40._0_8_ = local_458;
  local_488 = psubsb(auVar41,auVar40);
  uStack_1b0 = CONCAT44(uVar10,uStack_40);
  local_1b8 = local_498;
  auVar47._8_8_ = uStack_1c0;
  auVar47._0_8_ = local_1c8;
  auVar46._8_8_ = uStack_1b0;
  auVar46._0_8_ = local_498;
  local_478 = paddsb(auVar47,auVar46);
  local_2c8 = local_488._0_8_;
  uStack_2c0 = local_488._8_8_;
  uVar91 = local_488._8_8_ ^ 0x8080808080808080;
  local_ba8 = uVar1;
  uStack_ba0 = uVar2;
  local_b98 = uVar3;
  uStack_b90 = uVar4;
  local_ac8 = uVar14;
  uStack_ac0 = uVar15;
  _local_448 = auVar66;
  local_408 = &local_e28;
  local_3d8 = uVar16;
  local_3b8 = uVar17;
  local_378 = local_388;
  uStack_370 = uStack_380;
  local_358 = local_438;
  uStack_350 = uStack_430;
  local_348 = local_438;
  uStack_340 = uStack_430;
  local_2d8 = local_438;
  uStack_2d0 = uStack_430;
  local_2b8 = local_438;
  uStack_2b0 = uStack_430;
  local_298 = local_438;
  uStack_290 = uStack_430;
  uStack_270 = local_3a8;
  uStack_1d0 = uStack_260;
  local_1a8 = local_1c8;
  uStack_1a0 = uStack_1c0;
  local_198 = local_428;
  uStack_190 = uStack_420;
  local_188 = local_388;
  uStack_180 = local_388;
  uStack_140 = uVar18;
  local_f8 = local_438;
  uStack_f0 = uStack_430;
  local_d8 = local_428;
  uStack_d0 = uStack_420;
  local_58 = local_3a8;
  *local_de0 = local_488._0_8_ ^ 0x8080808080808080;
  puVar53[1] = uVar91;
  puVar54 = local_418;
  local_2e8 = local_478._0_8_;
  uStack_2e0 = local_478._8_8_;
  local_2f8 = local_438;
  uStack_2f0 = uStack_430;
  uVar91 = local_478._8_8_ ^ uStack_430;
  *local_418 = local_478._0_8_ ^ local_438;
  puVar54[1] = uVar91;
  a_01[1] = (longlong)puVar56;
  a_01[0] = (longlong)puVar57;
  b_02[1] = (longlong)puVar53;
  b_02[0] = (longlong)&local_e28;
  abs_diff(a_01,b_02);
  puVar53 = local_de0;
  local_b08 = local_f88;
  uVar14 = local_b08;
  uStack_b00 = uStack_f80;
  uVar15 = uStack_b00;
  local_af8 = (byte)extraout_XMM0_Qa_02;
  bStack_af7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_af6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_af5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_af4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_af3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_af2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_af1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_af0 = (byte)extraout_XMM0_Qb_02;
  bStack_aef = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_aee = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_aed = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_aec = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_aeb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_aea = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_ae9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_b08._0_1_ = (byte)local_f88;
  local_b08._1_1_ = (byte)((ulong)local_f88 >> 8);
  local_b08._2_1_ = (byte)((ulong)local_f88 >> 0x10);
  local_b08._3_1_ = (byte)((ulong)local_f88 >> 0x18);
  local_b08._4_1_ = (byte)((ulong)local_f88 >> 0x20);
  local_b08._5_1_ = (byte)((ulong)local_f88 >> 0x28);
  local_b08._6_1_ = (byte)((ulong)local_f88 >> 0x30);
  local_b08._7_1_ = (byte)((ulong)local_f88 >> 0x38);
  uStack_b00._0_1_ = (byte)uStack_f80;
  uStack_b00._1_1_ = (byte)((ulong)uStack_f80 >> 8);
  uStack_b00._2_1_ = (byte)((ulong)uStack_f80 >> 0x10);
  uStack_b00._3_1_ = (byte)((ulong)uStack_f80 >> 0x18);
  uStack_b00._4_1_ = (byte)((ulong)uStack_f80 >> 0x20);
  uStack_b00._5_1_ = (byte)((ulong)uStack_f80 >> 0x28);
  uStack_b00._6_1_ = (byte)((ulong)uStack_f80 >> 0x30);
  uStack_b00._7_1_ = (byte)((ulong)uStack_f80 >> 0x38);
  bVar58 = (local_af8 < (byte)local_b08) * (byte)local_b08 |
           (local_af8 >= (byte)local_b08) * local_af8;
  bVar68 = (bStack_af7 < local_b08._1_1_) * local_b08._1_1_ |
           (bStack_af7 >= local_b08._1_1_) * bStack_af7;
  bVar69 = (bStack_af6 < local_b08._2_1_) * local_b08._2_1_ |
           (bStack_af6 >= local_b08._2_1_) * bStack_af6;
  bVar73 = (bStack_af5 < local_b08._3_1_) * local_b08._3_1_ |
           (bStack_af5 >= local_b08._3_1_) * bStack_af5;
  bVar74 = (bStack_af4 < local_b08._4_1_) * local_b08._4_1_ |
           (bStack_af4 >= local_b08._4_1_) * bStack_af4;
  bVar78 = (bStack_af3 < local_b08._5_1_) * local_b08._5_1_ |
           (bStack_af3 >= local_b08._5_1_) * bStack_af3;
  bVar79 = (bStack_af2 < local_b08._6_1_) * local_b08._6_1_ |
           (bStack_af2 >= local_b08._6_1_) * bStack_af2;
  bVar83 = (bStack_af1 < local_b08._7_1_) * local_b08._7_1_ |
           (bStack_af1 >= local_b08._7_1_) * bStack_af1;
  bVar84 = (bStack_af0 < (byte)uStack_b00) * (byte)uStack_b00 |
           (bStack_af0 >= (byte)uStack_b00) * bStack_af0;
  bVar93 = (bStack_aef < uStack_b00._1_1_) * uStack_b00._1_1_ |
           (bStack_aef >= uStack_b00._1_1_) * bStack_aef;
  bVar94 = (bStack_aee < uStack_b00._2_1_) * uStack_b00._2_1_ |
           (bStack_aee >= uStack_b00._2_1_) * bStack_aee;
  bVar98 = (bStack_aed < uStack_b00._3_1_) * uStack_b00._3_1_ |
           (bStack_aed >= uStack_b00._3_1_) * bStack_aed;
  bVar99 = (bStack_aec < uStack_b00._4_1_) * uStack_b00._4_1_ |
           (bStack_aec >= uStack_b00._4_1_) * bStack_aec;
  bVar103 = (bStack_aeb < uStack_b00._5_1_) * uStack_b00._5_1_ |
            (bStack_aeb >= uStack_b00._5_1_) * bStack_aeb;
  bVar104 = (bStack_aea < uStack_b00._6_1_) * uStack_b00._6_1_ |
            (bStack_aea >= uStack_b00._6_1_) * bStack_aea;
  bVar108 = (bStack_ae9 < uStack_b00._7_1_) * uStack_b00._7_1_ |
            (bStack_ae9 >= uStack_b00._7_1_) * bStack_ae9;
  local_e48._0_2_ = CONCAT11(bVar68,bVar58);
  local_e48._0_3_ = CONCAT12(bVar69,(undefined2)local_e48);
  local_e48._0_4_ = CONCAT13(bVar73,(undefined3)local_e48);
  local_e48._0_5_ = CONCAT14(bVar74,(undefined4)local_e48);
  local_e48._0_6_ = CONCAT15(bVar78,(undefined5)local_e48);
  local_e48._0_7_ = CONCAT16(bVar79,(undefined6)local_e48);
  local_e48 = CONCAT17(bVar83,(undefined7)local_e48);
  uStack_e40._0_1_ = bVar84;
  uStack_e40._1_1_ = bVar93;
  uStack_e40._2_1_ = bVar94;
  uStack_e40._3_1_ = bVar98;
  uStack_e40._4_1_ = bVar99;
  uStack_e40._5_1_ = bVar103;
  uStack_e40._6_1_ = bVar104;
  uStack_e40._7_1_ = bVar108;
  local_b18 = local_e48;
  uStack_b10 = uStack_e40;
  local_b28 = uStack_e40;
  uStack_b20 = 0;
  local_e48._0_2_ =
       CONCAT11((bVar68 < bVar93) * bVar93 | (bVar68 >= bVar93) * bVar68,
                (bVar58 < bVar84) * bVar84 | (bVar58 >= bVar84) * bVar58);
  local_e48._0_3_ =
       CONCAT12((bVar69 < bVar94) * bVar94 | (bVar69 >= bVar94) * bVar69,(undefined2)local_e48);
  local_e48._0_4_ =
       CONCAT13((bVar73 < bVar98) * bVar98 | (bVar73 >= bVar98) * bVar73,(undefined3)local_e48);
  local_e48._0_5_ =
       CONCAT14((bVar74 < bVar99) * bVar99 | (bVar74 >= bVar99) * bVar74,(undefined4)local_e48);
  local_e48._0_6_ =
       CONCAT15((bVar78 < bVar103) * bVar103 | (bVar78 >= bVar103) * bVar78,(undefined5)local_e48);
  local_e48._0_7_ =
       CONCAT16((bVar79 < bVar104) * bVar104 | (bVar79 >= bVar104) * bVar79,(undefined6)local_e48);
  local_e48 = CONCAT17((bVar83 < bVar108) * bVar108 | (bVar83 >= bVar108) * bVar83,
                       (undefined7)local_e48);
  local_8f8 = local_e48;
  uStack_8f0 = uStack_e40;
  local_908 = local_f28;
  uStack_900 = uStack_f20;
  auVar36._8_8_ = uStack_e40;
  auVar36._0_8_ = local_e48;
  auVar35._8_8_ = uStack_f20;
  auVar35._0_8_ = local_f28;
  auVar66 = psubusb(auVar36,auVar35);
  local_e48 = auVar66._0_8_;
  uStack_e40 = auVar66._8_8_;
  local_bb8 = local_e48;
  uVar3 = local_bb8;
  uStack_bb0 = uStack_e40;
  uVar4 = uStack_bb0;
  local_bc8 = local_e18;
  uVar1 = local_bc8;
  uStack_bc0 = uStack_e10;
  uVar2 = uStack_bc0;
  local_bb8._0_1_ = auVar66[0];
  local_bb8._1_1_ = auVar66[1];
  local_bb8._2_1_ = auVar66[2];
  local_bb8._3_1_ = auVar66[3];
  local_bb8._4_1_ = auVar66[4];
  local_bb8._5_1_ = auVar66[5];
  local_bb8._6_1_ = auVar66[6];
  local_bb8._7_1_ = auVar66[7];
  uStack_bb0._0_1_ = auVar66[8];
  uStack_bb0._1_1_ = auVar66[9];
  uStack_bb0._2_1_ = auVar66[10];
  uStack_bb0._3_1_ = auVar66[0xb];
  uStack_bb0._4_1_ = auVar66[0xc];
  uStack_bb0._5_1_ = auVar66[0xd];
  uStack_bb0._6_1_ = auVar66[0xe];
  uStack_bb0._7_1_ = auVar66[0xf];
  local_bc8._0_1_ = (char)local_e18;
  local_bc8._1_1_ = (char)((ulong)local_e18 >> 8);
  local_bc8._2_1_ = (char)((ulong)local_e18 >> 0x10);
  local_bc8._3_1_ = (char)((ulong)local_e18 >> 0x18);
  local_bc8._4_1_ = (char)((ulong)local_e18 >> 0x20);
  local_bc8._5_1_ = (char)((ulong)local_e18 >> 0x28);
  local_bc8._6_1_ = (char)((ulong)local_e18 >> 0x30);
  local_bc8._7_1_ = (char)((ulong)local_e18 >> 0x38);
  uStack_bc0._0_1_ = (char)uStack_e10;
  uStack_bc0._1_1_ = (char)((ulong)uStack_e10 >> 8);
  uStack_bc0._2_1_ = (char)((ulong)uStack_e10 >> 0x10);
  uStack_bc0._3_1_ = (char)((ulong)uStack_e10 >> 0x18);
  uStack_bc0._4_1_ = (char)((ulong)uStack_e10 >> 0x20);
  uStack_bc0._5_1_ = (char)((ulong)uStack_e10 >> 0x28);
  uStack_bc0._6_1_ = (char)((ulong)uStack_e10 >> 0x30);
  uStack_bc0._7_1_ = (char)((ulong)uStack_e10 >> 0x38);
  local_e48._0_2_ =
       CONCAT11(-(local_bb8._1_1_ == local_bc8._1_1_),-((char)local_bb8 == (char)local_bc8));
  local_e48._0_3_ = CONCAT12(-(local_bb8._2_1_ == local_bc8._2_1_),(undefined2)local_e48);
  local_e48._0_4_ = CONCAT13(-(local_bb8._3_1_ == local_bc8._3_1_),(undefined3)local_e48);
  local_e48._0_5_ = CONCAT14(-(local_bb8._4_1_ == local_bc8._4_1_),(undefined4)local_e48);
  local_e48._0_6_ = CONCAT15(-(local_bb8._5_1_ == local_bc8._5_1_),(undefined5)local_e48);
  local_e48._0_7_ = CONCAT16(-(local_bb8._6_1_ == local_bc8._6_1_),(undefined6)local_e48);
  local_e48 = CONCAT17(-(local_bb8._7_1_ == local_bc8._7_1_),(undefined7)local_e48);
  uStack_e40._0_1_ = -((char)uStack_bb0 == (char)uStack_bc0);
  uStack_e40._1_1_ = -(uStack_bb0._1_1_ == uStack_bc0._1_1_);
  uStack_e40._2_1_ = -(uStack_bb0._2_1_ == uStack_bc0._2_1_);
  uStack_e40._3_1_ = -(uStack_bb0._3_1_ == uStack_bc0._3_1_);
  uStack_e40._4_1_ = -(uStack_bb0._4_1_ == uStack_bc0._4_1_);
  uStack_e40._5_1_ = -(uStack_bb0._5_1_ == uStack_bc0._5_1_);
  uStack_e40._6_1_ = -(uStack_bb0._6_1_ == uStack_bc0._6_1_);
  uStack_e40._7_1_ = -(uStack_bb0._7_1_ == uStack_bc0._7_1_);
  local_938 = local_e48;
  uStack_930 = uStack_e40;
  local_948 = local_e28;
  uStack_940 = uStack_e20;
  local_cd8 = local_e48 & local_e28;
  uStack_cd0 = uStack_e40 & uStack_e20;
  local_be8 = local_e18;
  uStack_be0 = uStack_e10;
  local_bd8._0_1_ = (char)local_cd8;
  local_bd8._1_1_ = (char)(local_cd8 >> 8);
  local_bd8._2_1_ = (char)(local_cd8 >> 0x10);
  local_bd8._3_1_ = (char)(local_cd8 >> 0x18);
  local_bd8._4_1_ = (char)(local_cd8 >> 0x20);
  local_bd8._5_1_ = (char)(local_cd8 >> 0x28);
  local_bd8._6_1_ = (char)(local_cd8 >> 0x30);
  local_bd8._7_1_ = (char)(local_cd8 >> 0x38);
  local_848 = -((char)local_bd8 == (char)local_bc8);
  cStack_847 = -(local_bd8._1_1_ == local_bc8._1_1_);
  cStack_846 = -(local_bd8._2_1_ == local_bc8._2_1_);
  cStack_845 = -(local_bd8._3_1_ == local_bc8._3_1_);
  cStack_844 = -(local_bd8._4_1_ == local_bc8._4_1_);
  cStack_843 = -(local_bd8._5_1_ == local_bc8._5_1_);
  cStack_842 = -(local_bd8._6_1_ == local_bc8._6_1_);
  cStack_841 = -(local_bd8._7_1_ == local_bc8._7_1_);
  cStack_840 = -((char)local_bd8 == (char)uStack_bc0);
  cStack_83f = -(local_bd8._1_1_ == uStack_bc0._1_1_);
  cStack_83e = -(local_bd8._2_1_ == uStack_bc0._2_1_);
  cStack_83d = -(local_bd8._3_1_ == uStack_bc0._3_1_);
  cStack_83c = -(local_bd8._4_1_ == uStack_bc0._4_1_);
  cStack_83b = -(local_bd8._5_1_ == uStack_bc0._5_1_);
  cStack_83a = -(local_bd8._6_1_ == uStack_bc0._6_1_);
  bStack_839 = -(local_bd8._7_1_ == uStack_bc0._7_1_);
  auVar39[1] = cStack_847;
  auVar39[0] = local_848;
  auVar39[2] = cStack_846;
  auVar39[3] = cStack_845;
  auVar39[4] = cStack_844;
  auVar39[5] = cStack_843;
  auVar39[6] = cStack_842;
  auVar39[7] = cStack_841;
  auVar39[8] = cStack_840;
  auVar39[9] = cStack_83f;
  auVar39[10] = cStack_83e;
  auVar39[0xb] = cStack_83d;
  auVar39[0xc] = cStack_83c;
  auVar39[0xd] = cStack_83b;
  auVar39[0xe] = cStack_83a;
  auVar39[0xf] = bStack_839;
  local_cc8 = local_cd8;
  uStack_cc0 = uStack_cd0;
  local_bd8 = local_cd8;
  uStack_bd0 = local_cd8;
  uStack_bc0 = uVar2;
  local_bb8 = uVar3;
  uStack_bb0 = uVar4;
  local_b08 = uVar14;
  uStack_b00 = uVar15;
  local_e48 = local_cd8;
  uStack_e40 = local_cd8;
  if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_839 >> 7) << 0xf) !=
      0xffff) {
    local_7aa = 4;
    local_1a = 4;
    local_1c = 4;
    local_1e = 4;
    local_20 = 4;
    local_22 = 4;
    local_24 = 4;
    local_26 = 4;
    local_28 = 4;
    local_fa8 = 0x4000400040004;
    uStack_fa0 = 0x4000400040004;
    lVar5 = (*local_db0)[0];
    lStack_ce0 = (*local_db0)[1];
    local_cf8 = local_e18;
    uStack_cf0 = uStack_e10;
    local_ce8._0_1_ = (undefined1)lVar5;
    local_ce8._1_1_ = (undefined1)((ulong)lVar5 >> 8);
    local_ce8._2_1_ = (undefined1)((ulong)lVar5 >> 0x10);
    local_ce8._3_1_ = (undefined1)((ulong)lVar5 >> 0x18);
    local_ce8._4_1_ = (undefined1)((ulong)lVar5 >> 0x20);
    local_ce8._5_1_ = (undefined1)((ulong)lVar5 >> 0x28);
    local_ce8._6_1_ = (undefined1)((ulong)lVar5 >> 0x30);
    local_ce8._7_1_ = (undefined1)((ulong)lVar5 >> 0x38);
    local_ea8 = (undefined1)local_ce8;
    cStack_ea7 = (char)local_bc8;
    uStack_ea6 = local_ce8._1_1_;
    cStack_ea5 = local_bc8._1_1_;
    uStack_ea4 = local_ce8._2_1_;
    cStack_ea3 = local_bc8._2_1_;
    uStack_ea2 = local_ce8._3_1_;
    cStack_ea1 = local_bc8._3_1_;
    uStack_ea0 = local_ce8._4_1_;
    cStack_e9f = local_bc8._4_1_;
    uStack_e9e = local_ce8._5_1_;
    cStack_e9d = local_bc8._5_1_;
    uStack_e9c = local_ce8._6_1_;
    cStack_e9b = local_bc8._6_1_;
    uStack_e9a = local_ce8._7_1_;
    cStack_e99 = local_bc8._7_1_;
    uVar2 = *local_dc0;
    uStack_d00 = local_dc0[1];
    local_d18 = local_e18;
    uStack_d10 = uStack_e10;
    local_d08._0_1_ = (undefined1)uVar2;
    local_d08._1_1_ = (undefined1)((ulong)uVar2 >> 8);
    local_d08._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
    local_d08._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
    local_d08._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
    local_d08._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
    local_d08._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
    local_d08._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    local_ec8 = (undefined1)local_d08;
    cStack_ec7 = (char)local_bc8;
    uStack_ec6 = local_d08._1_1_;
    cStack_ec5 = local_bc8._1_1_;
    uStack_ec4 = local_d08._2_1_;
    cStack_ec3 = local_bc8._2_1_;
    uStack_ec2 = local_d08._3_1_;
    cStack_ec1 = local_bc8._3_1_;
    uStack_ec0 = local_d08._4_1_;
    cStack_ebf = local_bc8._4_1_;
    uStack_ebe = local_d08._5_1_;
    cStack_ebd = local_bc8._5_1_;
    uStack_ebc = local_d08._6_1_;
    cStack_ebb = local_bc8._6_1_;
    uStack_eba = local_d08._7_1_;
    cStack_eb9 = local_bc8._7_1_;
    lVar6 = (*local_dd0)[0];
    lStack_d20 = (*local_dd0)[1];
    local_d38 = local_e18;
    uStack_d30 = uStack_e10;
    local_d28._0_1_ = (undefined1)lVar6;
    local_d28._1_1_ = (undefined1)((ulong)lVar6 >> 8);
    local_d28._2_1_ = (undefined1)((ulong)lVar6 >> 0x10);
    local_d28._3_1_ = (undefined1)((ulong)lVar6 >> 0x18);
    local_d28._4_1_ = (undefined1)((ulong)lVar6 >> 0x20);
    local_d28._5_1_ = (undefined1)((ulong)lVar6 >> 0x28);
    local_d28._6_1_ = (undefined1)((ulong)lVar6 >> 0x30);
    local_d28._7_1_ = (undefined1)((ulong)lVar6 >> 0x38);
    local_ee8 = (undefined1)local_d28;
    cStack_ee7 = (char)local_bc8;
    uStack_ee6 = local_d28._1_1_;
    cStack_ee5 = local_bc8._1_1_;
    uStack_ee4 = local_d28._2_1_;
    cStack_ee3 = local_bc8._2_1_;
    uStack_ee2 = local_d28._3_1_;
    cStack_ee1 = local_bc8._3_1_;
    uStack_ee0 = local_d28._4_1_;
    cStack_edf = local_bc8._4_1_;
    uStack_ede = local_d28._5_1_;
    cStack_edd = local_bc8._5_1_;
    uStack_edc = local_d28._6_1_;
    cStack_edb = local_bc8._6_1_;
    uStack_eda = local_d28._7_1_;
    cStack_ed9 = local_bc8._7_1_;
    lVar7 = *local_dd8;
    lStack_d40 = local_dd8[1];
    local_d58 = local_e18;
    uStack_d50 = uStack_e10;
    local_d48._0_1_ = (undefined1)lVar7;
    local_d48._1_1_ = (undefined1)((ulong)lVar7 >> 8);
    local_d48._2_1_ = (undefined1)((ulong)lVar7 >> 0x10);
    local_d48._3_1_ = (undefined1)((ulong)lVar7 >> 0x18);
    local_d48._4_1_ = (undefined1)((ulong)lVar7 >> 0x20);
    local_d48._5_1_ = (undefined1)((ulong)lVar7 >> 0x28);
    local_d48._6_1_ = (undefined1)((ulong)lVar7 >> 0x30);
    local_d48._7_1_ = (undefined1)((ulong)lVar7 >> 0x38);
    local_ef8 = (undefined1)local_d48;
    cStack_ef7 = (char)local_bc8;
    uStack_ef6 = local_d48._1_1_;
    cStack_ef5 = local_bc8._1_1_;
    uStack_ef4 = local_d48._2_1_;
    cStack_ef3 = local_bc8._2_1_;
    uStack_ef2 = local_d48._3_1_;
    cStack_ef1 = local_bc8._3_1_;
    uStack_ef0 = local_d48._4_1_;
    cStack_eef = local_bc8._4_1_;
    uStack_eee = local_d48._5_1_;
    cStack_eed = local_bc8._5_1_;
    uStack_eec = local_d48._6_1_;
    cStack_eeb = local_bc8._6_1_;
    uStack_eea = local_d48._7_1_;
    cStack_ee9 = local_bc8._7_1_;
    lVar8 = (*local_dc8)[0];
    lStack_d60 = (*local_dc8)[1];
    local_d78 = local_e18;
    uStack_d70 = uStack_e10;
    local_d68._0_1_ = (undefined1)lVar8;
    local_d68._1_1_ = (undefined1)((ulong)lVar8 >> 8);
    local_d68._2_1_ = (undefined1)((ulong)lVar8 >> 0x10);
    local_d68._3_1_ = (undefined1)((ulong)lVar8 >> 0x18);
    local_d68._4_1_ = (undefined1)((ulong)lVar8 >> 0x20);
    local_d68._5_1_ = (undefined1)((ulong)lVar8 >> 0x28);
    local_d68._6_1_ = (undefined1)((ulong)lVar8 >> 0x30);
    local_d68._7_1_ = (undefined1)((ulong)lVar8 >> 0x38);
    local_ed8 = (undefined1)local_d68;
    cStack_ed7 = (char)local_bc8;
    uStack_ed6 = local_d68._1_1_;
    cStack_ed5 = local_bc8._1_1_;
    uStack_ed4 = local_d68._2_1_;
    cStack_ed3 = local_bc8._2_1_;
    uStack_ed2 = local_d68._3_1_;
    cStack_ed1 = local_bc8._3_1_;
    uStack_ed0 = local_d68._4_1_;
    cStack_ecf = local_bc8._4_1_;
    uStack_ece = local_d68._5_1_;
    cStack_ecd = local_bc8._5_1_;
    uStack_ecc = local_d68._6_1_;
    cStack_ecb = local_bc8._6_1_;
    uStack_eca = local_d68._7_1_;
    cStack_ec9 = local_bc8._7_1_;
    lVar9 = *local_db8;
    lStack_d80 = local_db8[1];
    local_d98 = local_e18;
    uStack_d90 = uStack_e10;
    local_d88._0_1_ = (undefined1)lVar9;
    local_d88._1_1_ = (undefined1)((ulong)lVar9 >> 8);
    local_d88._2_1_ = (undefined1)((ulong)lVar9 >> 0x10);
    local_d88._3_1_ = (undefined1)((ulong)lVar9 >> 0x18);
    local_d88._4_1_ = (undefined1)((ulong)lVar9 >> 0x20);
    local_d88._5_1_ = (undefined1)((ulong)lVar9 >> 0x28);
    local_d88._6_1_ = (undefined1)((ulong)lVar9 >> 0x30);
    local_d88._7_1_ = (undefined1)((ulong)lVar9 >> 0x38);
    local_eb8 = (undefined1)local_d88;
    cStack_eb7 = (char)local_bc8;
    uStack_eb6 = local_d88._1_1_;
    cStack_eb5 = local_bc8._1_1_;
    uStack_eb4 = local_d88._2_1_;
    cStack_eb3 = local_bc8._2_1_;
    uStack_eb2 = local_d88._3_1_;
    cStack_eb1 = local_bc8._3_1_;
    uStack_eb0 = local_d88._4_1_;
    cStack_eaf = local_bc8._4_1_;
    uStack_eae = local_d88._5_1_;
    cStack_ead = local_bc8._5_1_;
    uStack_eac = local_d88._6_1_;
    cStack_eab = local_bc8._6_1_;
    uStack_eaa = local_d88._7_1_;
    cStack_ea9 = local_bc8._7_1_;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d28._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d28)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d28._2_1_,uVar10));
    local_5e8 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d28._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d28._5_1_,CONCAT11(local_bc8._4_1_,local_d28._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d28._6_1_,uVar12));
    uStack_5e0 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d28._7_1_,uVar13));
    local_5d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5d8._6_2_ = (short)((ulong)local_5e8 >> 0x30);
    uStack_5d0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_5d0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_5d0._6_2_ = (short)((ulong)uStack_5e0 >> 0x30);
    local_618 = CONCAT11((char)local_bc8,(undefined1)local_d28) * 2;
    sStack_616 = local_5d8._2_2_ * 2;
    sStack_614 = local_5d8._4_2_ * 2;
    sStack_612 = local_5d8._6_2_ * 2;
    sStack_610 = CONCAT11(local_bc8._4_1_,local_d28._4_1_) * 2;
    sStack_60e = uStack_5d0._2_2_ * 2;
    sStack_60c = uStack_5d0._4_2_ * 2;
    sStack_60a = uStack_5d0._6_2_ * 2;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d08._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d08)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d08._2_1_,uVar10));
    local_608 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d08._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d08._5_1_,CONCAT11(local_bc8._4_1_,local_d08._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d08._6_1_,uVar12));
    uStack_600 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d08._7_1_,uVar13));
    local_5f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5f8._6_2_ = (short)((ulong)local_608 >> 0x30);
    uStack_5f0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_5f0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_5f0._6_2_ = (short)((ulong)uStack_600 >> 0x30);
    local_628 = CONCAT11((char)local_bc8,(undefined1)local_d08) * 2;
    sStack_626 = local_5f8._2_2_ * 2;
    sStack_624 = local_5f8._4_2_ * 2;
    sStack_622 = local_5f8._6_2_ * 2;
    sStack_620 = CONCAT11(local_bc8._4_1_,local_d08._4_1_) * 2;
    sStack_61e = uStack_5f0._2_2_ * 2;
    sStack_61c = uStack_5f0._4_2_ * 2;
    sStack_61a = uStack_5f0._6_2_ * 2;
    local_638 = CONCAT26(sStack_612 + sStack_622,
                         CONCAT24(sStack_614 + sStack_624,
                                  CONCAT22(sStack_616 + sStack_626,local_618 + local_628)));
    uStack_630 = CONCAT26(sStack_60a + sStack_61a,
                          CONCAT24(sStack_60c + sStack_61c,
                                   CONCAT22(sStack_60e + sStack_61e,sStack_610 + sStack_620)));
    local_658 = local_618 + local_628 + 4;
    sStack_656 = sStack_616 + sStack_626 + 4;
    sStack_654 = sStack_614 + sStack_624 + 4;
    sStack_652 = sStack_612 + sStack_622 + 4;
    sStack_650 = sStack_610 + sStack_620 + 4;
    sStack_64e = sStack_60e + sStack_61e + 4;
    sStack_64c = sStack_60c + sStack_61c + 4;
    sStack_64a = sStack_60a + sStack_61a + 4;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_ce8._1_1_,CONCAT11((char)local_bc8,(undefined1)local_ce8)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_ce8._2_1_,uVar10));
    uVar30 = CONCAT17(local_bc8._3_1_,CONCAT16(local_ce8._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_ce8._5_1_,CONCAT11(local_bc8._4_1_,local_ce8._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_ce8._6_1_,uVar12));
    uVar32 = CONCAT17(local_bc8._7_1_,CONCAT16(local_ce8._7_1_,uVar13));
    local_668._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_668._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_668._6_2_ = (short)((ulong)uVar30 >> 0x30);
    uStack_660._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_660._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_660._6_2_ = (short)((ulong)uVar32 >> 0x30);
    sVar59 = local_658 + CONCAT11((char)local_bc8,(undefined1)local_ce8);
    local_668._2_2_ = sStack_656 + local_668._2_2_;
    local_668._4_2_ = sStack_654 + local_668._4_2_;
    local_668._6_2_ = sStack_652 + local_668._6_2_;
    sVar85 = sStack_650 + CONCAT11(local_bc8._4_1_,local_ce8._4_1_);
    uStack_660._2_2_ = sStack_64e + uStack_660._2_2_;
    uStack_660._4_2_ = sStack_64c + uStack_660._4_2_;
    uStack_660._6_2_ = sStack_64a + uStack_660._6_2_;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_ce8._1_1_,CONCAT11((char)local_bc8,(undefined1)local_ce8)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_ce8._2_1_,uVar10));
    local_688 = CONCAT17(local_bc8._3_1_,CONCAT16(local_ce8._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_ce8._5_1_,CONCAT11(local_bc8._4_1_,local_ce8._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_ce8._6_1_,uVar12));
    uStack_680 = CONCAT17(local_bc8._7_1_,CONCAT16(local_ce8._7_1_,uVar13));
    local_678._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_678._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_678._6_2_ = (short)((ulong)local_688 >> 0x30);
    uStack_670._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_670._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_670._6_2_ = (short)((ulong)uStack_680 >> 0x30);
    local_698 = CONCAT11((char)local_bc8,(undefined1)local_ce8) * 2;
    sStack_696 = local_678._2_2_ * 2;
    sStack_694 = local_678._4_2_ * 2;
    sStack_692 = local_678._6_2_ * 2;
    sStack_690 = CONCAT11(local_bc8._4_1_,local_ce8._4_1_) * 2;
    sStack_68e = uStack_670._2_2_ * 2;
    sStack_68c = uStack_670._4_2_ * 2;
    sStack_68a = uStack_670._6_2_ * 2;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d48._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d48)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d48._2_1_,uVar10));
    uVar3 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d48._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d48._5_1_,CONCAT11(local_bc8._4_1_,local_d48._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d48._6_1_,uVar12));
    uVar4 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d48._7_1_,uVar13));
    local_6a8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_6a8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_6a8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_6a0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_6a0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_6a0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    sVar60 = local_698 + CONCAT11((char)local_bc8,(undefined1)local_d48);
    sVar86 = sStack_690 + CONCAT11(local_bc8._4_1_,local_d48._4_1_);
    local_6b8 = CONCAT26(local_668._6_2_,CONCAT24(local_668._4_2_,CONCAT22(local_668._2_2_,sVar59)))
    ;
    uStack_6b0 = CONCAT26(uStack_660._6_2_,
                          CONCAT24(uStack_660._4_2_,CONCAT22(uStack_660._2_2_,sVar85)));
    local_6c8 = CONCAT26(sStack_692 + local_6a8._6_2_,
                         CONCAT24(sStack_694 + local_6a8._4_2_,
                                  CONCAT22(sStack_696 + local_6a8._2_2_,sVar60)));
    uStack_6c0 = CONCAT26(sStack_68a + uStack_6a0._6_2_,
                          CONCAT24(sStack_68c + uStack_6a0._4_2_,
                                   CONCAT22(sStack_68e + uStack_6a0._2_2_,sVar86)));
    local_9b8 = sVar59 + sVar60;
    uStack_9b6 = local_668._2_2_ + sStack_696 + local_6a8._2_2_;
    uStack_9b4 = local_668._4_2_ + sStack_694 + local_6a8._4_2_;
    uStack_9b2 = local_668._6_2_ + sStack_692 + local_6a8._6_2_;
    uStack_9b0 = sVar85 + sVar86;
    uStack_9ae = uStack_660._2_2_ + sStack_68e + uStack_6a0._2_2_;
    uStack_9ac = uStack_660._4_2_ + sStack_68c + uStack_6a0._4_2_;
    uStack_9aa = uStack_660._6_2_ + sStack_68a + uStack_6a0._6_2_;
    local_9bc = 3;
    uVar61 = local_9b8 >> 3;
    uVar70 = uStack_9b6 >> 3;
    uVar75 = uStack_9b4 >> 3;
    uVar80 = uStack_9b2 >> 3;
    uVar87 = uStack_9b0 >> 3;
    uVar95 = uStack_9ae >> 3;
    uVar100 = uStack_9ac >> 3;
    uVar105 = uStack_9aa >> 3;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d48._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d48)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d48._2_1_,uVar10));
    local_6e8 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d48._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d48._5_1_,CONCAT11(local_bc8._4_1_,local_d48._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d48._6_1_,uVar12));
    uStack_6e0 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d48._7_1_,uVar13));
    local_6d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_6d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_6d8._6_2_ = (short)((ulong)local_6e8 >> 0x30);
    uStack_6d0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_6d0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_6d0._6_2_ = (short)((ulong)uStack_6e0 >> 0x30);
    local_6f8 = CONCAT11((char)local_bc8,(undefined1)local_d48) * 2;
    sStack_6f6 = local_6d8._2_2_ * 2;
    sStack_6f4 = local_6d8._4_2_ * 2;
    sStack_6f2 = local_6d8._6_2_ * 2;
    sStack_6f0 = CONCAT11(local_bc8._4_1_,local_d48._4_1_) * 2;
    sStack_6ee = uStack_6d0._2_2_ * 2;
    sStack_6ec = uStack_6d0._4_2_ * 2;
    sStack_6ea = uStack_6d0._6_2_ * 2;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d68._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d68)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d68._2_1_,uVar10));
    uVar16 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d68._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d68._5_1_,CONCAT11(local_bc8._4_1_,local_d68._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d68._6_1_,uVar12));
    uVar18 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d68._7_1_,uVar13));
    local_708._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_708._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_708._6_2_ = (short)((ulong)uVar16 >> 0x30);
    uStack_700._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_700._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_700._6_2_ = (short)((ulong)uVar18 >> 0x30);
    sVar60 = local_6f8 + CONCAT11((char)local_bc8,(undefined1)local_d68);
    sVar86 = sStack_6f0 + CONCAT11(local_bc8._4_1_,local_d68._4_1_);
    local_718 = CONCAT26(local_668._6_2_,CONCAT24(local_668._4_2_,CONCAT22(local_668._2_2_,sVar59)))
    ;
    uStack_710 = CONCAT26(uStack_660._6_2_,
                          CONCAT24(uStack_660._4_2_,CONCAT22(uStack_660._2_2_,sVar85)));
    local_728 = CONCAT26(sStack_6f2 + local_708._6_2_,
                         CONCAT24(sStack_6f4 + local_708._4_2_,
                                  CONCAT22(sStack_6f6 + local_708._2_2_,sVar60)));
    uStack_720 = CONCAT26(sStack_6ea + uStack_700._6_2_,
                          CONCAT24(sStack_6ec + uStack_700._4_2_,
                                   CONCAT22(sStack_6ee + uStack_700._2_2_,sVar86)));
    uVar62 = sVar59 + sVar60;
    uVar71 = local_668._2_2_ + sStack_6f6 + local_708._2_2_;
    uVar76 = local_668._4_2_ + sStack_6f4 + local_708._4_2_;
    uVar81 = local_668._6_2_ + sStack_6f2 + local_708._6_2_;
    uVar88 = sVar85 + sVar86;
    uVar96 = uStack_660._2_2_ + sStack_6ee + uStack_700._2_2_;
    uVar101 = uStack_660._4_2_ + sStack_6ec + uStack_700._4_2_;
    uVar106 = uStack_660._6_2_ + sStack_6ea + uStack_700._6_2_;
    local_9d8 = CONCAT26(uVar81,CONCAT24(uVar76,CONCAT22(uVar71,uVar62)));
    uStack_9d0 = CONCAT26(uVar106,CONCAT24(uVar101,CONCAT22(uVar96,uVar88)));
    local_9dc = 3;
    uVar63 = uVar62 >> 3;
    uVar72 = uVar71 >> 3;
    uVar77 = uVar76 >> 3;
    uVar82 = uVar81 >> 3;
    uVar89 = uVar88 >> 3;
    uVar97 = uVar96 >> 3;
    uVar102 = uVar101 >> 3;
    uVar107 = uVar106 >> 3;
    local_4d8 = CONCAT26(uVar82,CONCAT24(uVar77,CONCAT22(uVar72,uVar63)));
    uStack_4d0 = CONCAT26(uVar107,CONCAT24(uVar102,CONCAT22(uVar97,uVar89)));
    local_4e8 = CONCAT26(uVar80,CONCAT24(uVar75,CONCAT22(uVar70,uVar61)));
    uStack_4e0 = CONCAT26(uVar105,CONCAT24(uVar100,CONCAT22(uVar95,uVar87)));
    local_e88 = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_e87 = (uVar72 != 0) * (uVar72 < 0x100) * (char)uVar72 - (0xff < uVar72);
    cStack_e86 = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
    cStack_e85 = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
    cStack_e84 = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
    cStack_e83 = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_e82 = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
    cStack_e81 = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
    cStack_e80 = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
    cStack_e7f = (uVar70 != 0) * (uVar70 < 0x100) * (char)uVar70 - (0xff < uVar70);
    cStack_e7e = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
    cStack_e7d = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
    cStack_e7c = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
    cStack_e7b = (uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95);
    cStack_e7a = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
    cStack_e79 = (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105);
    local_558 = CONCAT26(uVar81,CONCAT24(uVar76,CONCAT22(uVar71,uVar62)));
    uStack_550 = CONCAT26(uVar106,CONCAT24(uVar101,CONCAT22(uVar96,uVar88)));
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_ce8._1_1_,CONCAT11((char)local_bc8,(undefined1)local_ce8)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_ce8._2_1_,uVar10));
    uVar31 = CONCAT17(local_bc8._3_1_,CONCAT16(local_ce8._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_ce8._5_1_,CONCAT11(local_bc8._4_1_,local_ce8._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_ce8._6_1_,uVar12));
    uVar33 = CONCAT17(local_bc8._7_1_,CONCAT16(local_ce8._7_1_,uVar13));
    local_568._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_568._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_568._6_2_ = (short)((ulong)uVar31 >> 0x30);
    uStack_560._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_560._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_560._6_2_ = (short)((ulong)uVar33 >> 0x30);
    local_578 = uVar62 - CONCAT11((char)local_bc8,(undefined1)local_ce8);
    sStack_576 = uVar71 - local_568._2_2_;
    sStack_574 = uVar76 - local_568._4_2_;
    sStack_572 = uVar81 - local_568._6_2_;
    sStack_570 = uVar88 - CONCAT11(local_bc8._4_1_,local_ce8._4_1_);
    sStack_56e = uVar96 - uStack_560._2_2_;
    sStack_56c = uVar101 - uStack_560._4_2_;
    sStack_56a = uVar106 - uStack_560._6_2_;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d08._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d08)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d08._2_1_,uVar10));
    uVar20 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d08._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d08._5_1_,CONCAT11(local_bc8._4_1_,local_d08._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d08._6_1_,uVar12));
    uVar22 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d08._7_1_,uVar13));
    local_588._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_588._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_588._6_2_ = (short)((ulong)uVar20 >> 0x30);
    uStack_580._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_580._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_580._6_2_ = (short)((ulong)uVar22 >> 0x30);
    sVar59 = local_578 - CONCAT11((char)local_bc8,(undefined1)local_d08);
    sVar85 = sStack_570 - CONCAT11(local_bc8._4_1_,local_d08._4_1_);
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d68._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d68)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d68._2_1_,uVar10));
    uVar17 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d68._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d68._5_1_,CONCAT11(local_bc8._4_1_,local_d68._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d68._6_1_,uVar12));
    uVar19 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d68._7_1_,uVar13));
    uVar25 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d88._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d88)));
    uVar26 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d88._2_1_,uVar25));
    uVar24 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d88._3_1_,uVar26));
    uVar28 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d88._5_1_,CONCAT11(local_bc8._4_1_,local_d88._4_1_)));
    uVar29 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d88._6_1_,uVar28));
    uVar27 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d88._7_1_,uVar29));
    local_738._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_738._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_738._6_2_ = (short)((ulong)uVar17 >> 0x30);
    uStack_730._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_730._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_730._6_2_ = (short)((ulong)uVar19 >> 0x30);
    local_748._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_748._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_748._6_2_ = (short)((ulong)uVar24 >> 0x30);
    uStack_740._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_740._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_740._6_2_ = (short)((ulong)uVar27 >> 0x30);
    sVar60 = CONCAT11((char)local_bc8,(undefined1)local_d68) +
             CONCAT11((char)local_bc8,(undefined1)local_d88);
    sVar86 = CONCAT11(local_bc8._4_1_,local_d68._4_1_) + CONCAT11(local_bc8._4_1_,local_d88._4_1_);
    local_758 = CONCAT26(sStack_572 - local_588._6_2_,
                         CONCAT24(sStack_574 - local_588._4_2_,
                                  CONCAT22(sStack_576 - local_588._2_2_,sVar59)));
    uStack_750 = CONCAT26(sStack_56a - uStack_580._6_2_,
                          CONCAT24(sStack_56c - uStack_580._4_2_,
                                   CONCAT22(sStack_56e - uStack_580._2_2_,sVar85)));
    local_768 = CONCAT26(local_738._6_2_ + local_748._6_2_,
                         CONCAT24(local_738._4_2_ + local_748._4_2_,
                                  CONCAT22(local_738._2_2_ + local_748._2_2_,sVar60)));
    uStack_760 = CONCAT26(uStack_730._6_2_ + uStack_740._6_2_,
                          CONCAT24(uStack_730._4_2_ + uStack_740._4_2_,
                                   CONCAT22(uStack_730._2_2_ + uStack_740._2_2_,sVar86)));
    uVar61 = sVar59 + sVar60;
    uVar62 = (sStack_576 - local_588._2_2_) + local_738._2_2_ + local_748._2_2_;
    uVar63 = (sStack_574 - local_588._4_2_) + local_738._4_2_ + local_748._4_2_;
    uVar70 = (sStack_572 - local_588._6_2_) + local_738._6_2_ + local_748._6_2_;
    uVar71 = sVar85 + sVar86;
    uVar72 = (sStack_56e - uStack_580._2_2_) + uStack_730._2_2_ + uStack_740._2_2_;
    uVar75 = (sStack_56c - uStack_580._4_2_) + uStack_730._4_2_ + uStack_740._4_2_;
    uVar76 = (sStack_56a - uStack_580._6_2_) + uStack_730._6_2_ + uStack_740._6_2_;
    local_9f8 = CONCAT26(uVar70,CONCAT24(uVar63,CONCAT22(uVar62,uVar61)));
    uStack_9f0 = CONCAT26(uVar76,CONCAT24(uVar75,CONCAT22(uVar72,uVar71)));
    local_9fc = 3;
    local_fd8 = uVar61 >> 3;
    uStack_fd6 = uVar62 >> 3;
    uStack_fd4 = uVar63 >> 3;
    uStack_fd2 = uVar70 >> 3;
    uStack_fd0 = uVar71 >> 3;
    uStack_fce = uVar72 >> 3;
    uStack_fcc = uVar75 >> 3;
    uStack_fca = uVar76 >> 3;
    local_598 = CONCAT26(uVar70,CONCAT24(uVar63,CONCAT22(uVar62,uVar61)));
    uStack_590 = CONCAT26(uVar76,CONCAT24(uVar75,CONCAT22(uVar72,uVar71)));
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d08._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d08)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d08._2_1_,uVar10));
    uVar21 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d08._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d08._5_1_,CONCAT11(local_bc8._4_1_,local_d08._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d08._6_1_,uVar12));
    uVar23 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d08._7_1_,uVar13));
    local_5a8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5a8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5a8._6_2_ = (short)((ulong)uVar21 >> 0x30);
    uStack_5a0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_5a0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_5a0._6_2_ = (short)((ulong)uVar23 >> 0x30);
    local_5b8 = uVar61 - CONCAT11((char)local_bc8,(undefined1)local_d08);
    sStack_5b6 = uVar62 - local_5a8._2_2_;
    sStack_5b4 = uVar63 - local_5a8._4_2_;
    sStack_5b2 = uVar70 - local_5a8._6_2_;
    sStack_5b0 = uVar71 - CONCAT11(local_bc8._4_1_,local_d08._4_1_);
    sStack_5ae = uVar72 - uStack_5a0._2_2_;
    sStack_5ac = uVar75 - uStack_5a0._4_2_;
    sStack_5aa = uVar76 - uStack_5a0._6_2_;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d28._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d28)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d28._2_1_,uVar10));
    uVar14 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d28._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d28._5_1_,CONCAT11(local_bc8._4_1_,local_d28._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d28._6_1_,uVar12));
    uVar15 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d28._7_1_,uVar13));
    local_5c8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5c8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5c8._6_2_ = (short)((ulong)uVar14 >> 0x30);
    uStack_5c0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_5c0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_5c0._6_2_ = (short)((ulong)uVar15 >> 0x30);
    local_fb8 = local_5b8 - CONCAT11((char)local_bc8,(undefined1)local_d28);
    sStack_fb6 = sStack_5b6 - local_5c8._2_2_;
    sStack_fb4 = sStack_5b4 - local_5c8._4_2_;
    sStack_fb2 = sStack_5b2 - local_5c8._6_2_;
    sStack_fb0 = sStack_5b0 - CONCAT11(local_bc8._4_1_,local_d28._4_1_);
    sStack_fae = sStack_5ae - uStack_5c0._2_2_;
    sStack_fac = sStack_5ac - uStack_5c0._4_2_;
    sStack_faa = sStack_5aa - uStack_5c0._6_2_;
    uVar10 = CONCAT13(local_bc8._1_1_,
                      CONCAT12(local_d88._1_1_,CONCAT11((char)local_bc8,(undefined1)local_d88)));
    uVar11 = CONCAT15(local_bc8._2_1_,CONCAT14(local_d88._2_1_,uVar10));
    local_788 = CONCAT17(local_bc8._3_1_,CONCAT16(local_d88._3_1_,uVar11));
    uVar12 = CONCAT13(local_bc8._5_1_,
                      CONCAT12(local_d88._5_1_,CONCAT11(local_bc8._4_1_,local_d88._4_1_)));
    uVar13 = CONCAT15(local_bc8._6_1_,CONCAT14(local_d88._6_1_,uVar12));
    uStack_780 = CONCAT17(local_bc8._7_1_,CONCAT16(local_d88._7_1_,uVar13));
    local_778._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_778._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_778._6_2_ = (short)((ulong)local_788 >> 0x30);
    uStack_770._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_770._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_770._6_2_ = (short)((ulong)uStack_780 >> 0x30);
    local_fc8 = CONCAT11((char)local_bc8,(undefined1)local_d88) * 2;
    sStack_fc6 = local_778._2_2_ * 2;
    sStack_fc4 = local_778._4_2_ * 2;
    sStack_fc2 = local_778._6_2_ * 2;
    sStack_fc0 = CONCAT11(local_bc8._4_1_,local_d88._4_1_) * 2;
    sStack_fbe = uStack_770._2_2_ * 2;
    sStack_fbc = uStack_770._4_2_ * 2;
    sStack_fba = uStack_770._6_2_ * 2;
    local_798 = CONCAT26(sStack_fb2,CONCAT24(sStack_fb4,CONCAT22(sStack_fb6,local_fb8)));
    uStack_790 = CONCAT26(sStack_faa,CONCAT24(sStack_fac,CONCAT22(sStack_fae,sStack_fb0)));
    local_7a8 = CONCAT26(sStack_fc2,CONCAT24(sStack_fc4,CONCAT22(sStack_fc6,local_fc8)));
    uStack_7a0 = CONCAT26(sStack_fba,CONCAT24(sStack_fbc,CONCAT22(sStack_fbe,sStack_fc0)));
    local_a18 = local_fb8 + local_fc8;
    uStack_a16 = sStack_fb6 + sStack_fc6;
    uStack_a14 = sStack_fb4 + sStack_fc4;
    uStack_a12 = sStack_fb2 + sStack_fc2;
    uStack_a10 = sStack_fb0 + sStack_fc0;
    uStack_a0e = sStack_fae + sStack_fbe;
    uStack_a0c = sStack_fac + sStack_fbc;
    uStack_a0a = sStack_faa + sStack_fba;
    local_a1c = 3;
    local_fe8 = local_a18 >> 3;
    uStack_fe6 = uStack_a16 >> 3;
    uStack_fe4 = uStack_a14 >> 3;
    uStack_fe2 = uStack_a12 >> 3;
    uStack_fe0 = uStack_a10 >> 3;
    uStack_fde = uStack_a0e >> 3;
    uStack_fdc = uStack_a0c >> 3;
    uStack_fda = uStack_a0a >> 3;
    local_4f8 = CONCAT26(uStack_fd2,CONCAT24(uStack_fd4,CONCAT22(uStack_fd6,local_fd8)));
    uStack_4f0 = CONCAT26(uStack_fca,CONCAT24(uStack_fcc,CONCAT22(uStack_fce,uStack_fd0)));
    local_508 = CONCAT26(uStack_fe2,CONCAT24(uStack_fe4,CONCAT22(uStack_fe6,local_fe8)));
    uStack_500 = CONCAT26(uStack_fda,CONCAT24(uStack_fdc,CONCAT22(uStack_fde,uStack_fe0)));
    local_e98 = (local_fd8 != 0) * (local_fd8 < 0x100) * (char)local_fd8 - (0xff < local_fd8);
    cStack_e97 = (uStack_fd6 != 0) * (uStack_fd6 < 0x100) * (char)uStack_fd6 - (0xff < uStack_fd6);
    cStack_e96 = (uStack_fd4 != 0) * (uStack_fd4 < 0x100) * (char)uStack_fd4 - (0xff < uStack_fd4);
    cStack_e95 = (uStack_fd2 != 0) * (uStack_fd2 < 0x100) * (char)uStack_fd2 - (0xff < uStack_fd2);
    cStack_e94 = (uStack_fd0 != 0) * (uStack_fd0 < 0x100) * (char)uStack_fd0 - (0xff < uStack_fd0);
    cStack_e93 = (uStack_fce != 0) * (uStack_fce < 0x100) * (char)uStack_fce - (0xff < uStack_fce);
    cStack_e92 = (uStack_fcc != 0) * (uStack_fcc < 0x100) * (char)uStack_fcc - (0xff < uStack_fcc);
    cStack_e91 = (uStack_fca != 0) * (uStack_fca < 0x100) * (char)uStack_fca - (0xff < uStack_fca);
    cStack_e90 = (local_fe8 != 0) * (local_fe8 < 0x100) * (char)local_fe8 - (0xff < local_fe8);
    cStack_e8f = (uStack_fe6 != 0) * (uStack_fe6 < 0x100) * (char)uStack_fe6 - (0xff < uStack_fe6);
    cStack_e8e = (uStack_fe4 != 0) * (uStack_fe4 < 0x100) * (char)uStack_fe4 - (0xff < uStack_fe4);
    cStack_e8d = (uStack_fe2 != 0) * (uStack_fe2 < 0x100) * (char)uStack_fe2 - (0xff < uStack_fe2);
    cStack_e8c = (uStack_fe0 != 0) * (uStack_fe0 < 0x100) * (char)uStack_fe0 - (0xff < uStack_fe0);
    cStack_e8b = (uStack_fde != 0) * (uStack_fde < 0x100) * (char)uStack_fde - (0xff < uStack_fde);
    cStack_e8a = (uStack_fdc != 0) * (uStack_fdc < 0x100) * (char)uStack_fdc - (0xff < uStack_fdc);
    cStack_e89 = (uStack_fda != 0) * (uStack_fda < 0x100) * (char)uStack_fda - (0xff < uStack_fda);
    local_7d8 = *local_de0;
    uStack_7d0 = local_de0[1];
    local_f18 = ~local_cd8 & local_7d8;
    uStack_f10 = ~local_cd8 & uStack_7d0;
    local_968 = CONCAT17(cStack_e91,
                         CONCAT16(cStack_e92,
                                  CONCAT15(cStack_e93,
                                           CONCAT14(cStack_e94,
                                                    CONCAT13(cStack_e95,
                                                             CONCAT12(cStack_e96,
                                                                      CONCAT11(cStack_e97,local_e98)
                                                                     ))))));
    uStack_960 = CONCAT17(cStack_e89,
                          CONCAT16(cStack_e8a,
                                   CONCAT15(cStack_e8b,
                                            CONCAT14(cStack_e8c,
                                                     CONCAT13(cStack_e8d,
                                                              CONCAT12(cStack_e8e,
                                                                       CONCAT11(cStack_e8f,
                                                                                cStack_e90)))))));
    uVar91 = local_cd8 & uStack_960;
    local_d88 = lVar9;
    local_d68 = lVar8;
    local_d48 = lVar7;
    local_d28 = lVar6;
    local_d08 = uVar2;
    local_ce8 = lVar5;
    local_bc8 = uVar1;
    local_958 = local_cd8;
    uStack_950 = local_cd8;
    local_7c8 = local_cd8;
    uStack_7c0 = local_cd8;
    local_778 = local_788;
    uStack_770 = uStack_780;
    local_748 = uVar24;
    uStack_740 = uVar27;
    local_738 = uVar17;
    uStack_730 = uVar19;
    local_708 = uVar16;
    uStack_700 = uVar18;
    local_6d8 = local_6e8;
    uStack_6d0 = uStack_6e0;
    local_6a8 = uVar3;
    uStack_6a0 = uVar4;
    local_678 = local_688;
    uStack_670 = uStack_680;
    local_668 = uVar30;
    uStack_660 = uVar32;
    local_648 = local_fa8;
    uStack_640 = uStack_fa0;
    local_5f8 = local_608;
    uStack_5f0 = uStack_600;
    local_5d8 = local_5e8;
    uStack_5d0 = uStack_5e0;
    local_5c8 = uVar14;
    uStack_5c0 = uVar15;
    local_5a8 = uVar21;
    uStack_5a0 = uVar23;
    local_588 = uVar20;
    uStack_580 = uVar22;
    local_568 = uVar31;
    uStack_560 = uVar33;
    local_38 = local_fa8;
    uStack_30 = uStack_fa0;
    *local_de0 = local_cd8 & local_968;
    puVar53[1] = uVar91;
    puVar53 = local_de0;
    local_818 = *local_de0;
    uStack_810 = local_de0[1];
    local_808 = local_f18;
    uStack_800 = uStack_f10;
    uVar91 = uStack_f10 | uStack_810;
    *local_de0 = local_f18 | local_818;
    puVar53[1] = uVar91;
    puVar53 = local_de8;
    uVar91 = *local_de8;
    uVar64 = local_de8[1];
    local_7e8 = local_e48;
    uVar65 = local_7e8;
    uStack_7e0 = uStack_e40;
    uVar90 = uStack_7e0;
    local_7e8._0_4_ = (uint)local_e48;
    local_7e8._4_4_ = (uint)(local_e48 >> 0x20);
    uStack_7e0._0_4_ = (uint)uStack_e40;
    uStack_7e0._4_4_ = (uint)(uStack_e40 >> 0x20);
    local_7f8._0_4_ = (uint)uVar91;
    local_7f8._4_4_ = (uint)(uVar91 >> 0x20);
    uStack_7f0._0_4_ = (uint)uVar64;
    uStack_7f0._4_4_ = (uint)(uVar64 >> 0x20);
    local_f08 = ((uint)local_7e8 ^ 0xffffffff) & (uint)local_7f8;
    uStack_f04 = (local_7e8._4_4_ ^ 0xffffffff) & local_7f8._4_4_;
    uStack_f00 = ((uint)uStack_7e0 ^ 0xffffffff) & (uint)uStack_7f0;
    uStack_efc = (uStack_7e0._4_4_ ^ 0xffffffff) & uStack_7f0._4_4_;
    local_988 = CONCAT17(cStack_e81,
                         CONCAT16(cStack_e82,
                                  CONCAT15(cStack_e83,
                                           CONCAT14(cStack_e84,
                                                    CONCAT13(cStack_e85,
                                                             CONCAT12(cStack_e86,
                                                                      CONCAT11(cStack_e87,local_e88)
                                                                     ))))));
    uStack_980 = CONCAT17(cStack_e79,
                          CONCAT16(cStack_e7a,
                                   CONCAT15(cStack_e7b,
                                            CONCAT14(cStack_e7c,
                                                     CONCAT13(cStack_e7d,
                                                              CONCAT12(cStack_e7e,
                                                                       CONCAT11(cStack_e7f,
                                                                                cStack_e80)))))));
    local_978 = local_e48;
    uStack_970 = uStack_e40;
    uVar92 = uStack_e40 & uStack_980;
    local_7f8 = uVar91;
    uStack_7f0 = uVar64;
    local_7e8 = uVar65;
    uStack_7e0 = uVar90;
    *local_de8 = local_e48 & local_988;
    puVar53[1] = uVar92;
    puVar53 = local_de8;
    local_828 = CONCAT44(uStack_f04,local_f08);
    uStack_820 = CONCAT44(uStack_efc,uStack_f00);
    local_838 = *local_de8;
    uStack_830 = local_de8[1];
    uVar91 = uStack_820 | uStack_830;
    *local_de8 = local_828 | local_838;
    puVar53[1] = uVar91;
    uVar1 = local_bc8;
  }
  local_bc8 = uVar1;
  local_12f8[2] = lStack_1300;
  uStack_12e0 = 0;
  local_12f8[0] = uStack_1310;
  local_12f8[1] = 0;
  palVar55 = (__m128i *)&local_1308;
  transpose4x8_8x4_sse2
            ((__m128i *)(local_12f8 + 2),palVar55,(__m128i *)&local_1318,(__m128i *)local_12f8,
             (__m128i *)&stack0xffffffffffffee18,(__m128i *)&stack0xffffffffffffee08,
             (__m128i *)(local_1218 + 2),(__m128i *)local_1218,(__m128i *)(local_1238 + 2),
             (__m128i *)local_1238,(__m128i *)(local_1258 + 2),(__m128i *)local_1258);
  v[1] = extraout_RDX;
  v[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2),v);
  v_00[1] = extraout_RDX_00;
  v_00[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)local_1184),v_00);
  v_01[1] = extraout_RDX_01;
  v_01[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 << 1)),v_01);
  v_02[1] = extraout_RDX_02;
  v_02[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 * 3)),v_02);
  v_03[1] = extraout_RDX_03;
  v_03[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 << 2)),v_03);
  v_04[1] = extraout_RDX_04;
  v_04[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 * 5)),v_04);
  v_05[1] = extraout_RDX_05;
  v_05[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 * 6)),v_05);
  v_06[1] = extraout_RDX_06;
  v_06[0] = (longlong)palVar55;
  xx_storel_32((void *)(local_1180 + -2 + (long)(local_1184 * 7)),v_06);
  return;
}

Assistant:

void aom_lpf_vertical_6_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0,
                                  const uint8_t *_blimit1,
                                  const uint8_t *_limit1,
                                  const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0;
  __m128i p1p0, q1q0;
  __m128i d0d1, d2d3, d4d5, d6d7;

  x0 = _mm_loadl_epi64((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)((s - 3) + 7 * p));

  transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0d1, &d2d3, &d4d5,
                    &d6d7);

  d1 = _mm_srli_si128(d0d1, 8);
  d3 = _mm_srli_si128(d2d3, 8);
  d5 = _mm_srli_si128(d4d5, 8);
  d7 = _mm_srli_si128(d6d7, 8);

  lpf_internal_6_dual_sse2(&d0d1, &d5, &d1, &d4d5, &d2d3, &d3, &q1q0, &p1p0,
                           &blimit, &limit, &thresh);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  transpose4x8_8x4_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3, &d4, &d5,
                        &d6, &d7);

  xx_storel_32((s - 2 + 0 * p), d0);
  xx_storel_32((s - 2 + 1 * p), d1);
  xx_storel_32((s - 2 + 2 * p), d2);
  xx_storel_32((s - 2 + 3 * p), d3);
  xx_storel_32((s - 2 + 4 * p), d4);
  xx_storel_32((s - 2 + 5 * p), d5);
  xx_storel_32((s - 2 + 6 * p), d6);
  xx_storel_32((s - 2 + 7 * p), d7);
}